

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_mkdtemp(void)

{
  void *pvVar1;
  ssize_t sVar2;
  undefined8 uVar3;
  ushort uVar4;
  int iVar5;
  int extraout_EAX;
  uint uVar6;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  __uid_t _Var7;
  int extraout_EAX_09;
  int extraout_EAX_10;
  int extraout_EAX_11;
  int extraout_EAX_12;
  int extraout_EAX_13;
  size_t sVar8;
  uv_loop_t *puVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  int __fd;
  uv_os_fd_t uVar14;
  uv_loop_t *unaff_RBX;
  uv_loop_t *puVar15;
  uv_loop_t **ppuVar16;
  uv_fs_t *puVar17;
  uv_loop_t **path;
  uv_fs_t *unaff_R14;
  uv_fs_t *puVar18;
  undefined8 unaff_R15;
  uv__queue *puVar19;
  uv_buf_t uVar20;
  int64_t eval_b;
  int64_t eval_a;
  uv_fs_t uStackY_1518;
  uv_loop_t *puStackY_1358;
  uv_fs_t *puStackY_1350;
  undefined8 uStackY_1340;
  code *pcStackY_1338;
  undefined1 auStack_1318 [8];
  undefined1 auStack_1310 [488];
  undefined8 uStack_1128;
  undefined8 uStack_1118;
  undefined1 auStack_1110 [16];
  undefined1 auStack_1100 [64];
  uv_fs_t uStack_10c0;
  uv_loop_t *puStack_f00;
  uv_fs_t *puStack_ef8;
  undefined1 auStack_ed8 [504];
  undefined8 uStack_ce0;
  uv_loop_t *puStack_cd8;
  uv_loop_t *puStack_cd0;
  uv_fs_t uStack_cc8;
  uv_loop_t *puStack_b08;
  uv_loop_t *puStack_af0;
  uv_loop_t *puStack_ae8;
  uv_fs_t uStack_ae0;
  uv_loop_t *puStack_920;
  uv_fs_t *puStack_918;
  code *pcStack_910;
  undefined8 uStack_900;
  code *pcStack_8f8;
  uv_loop_t *puStack_8e8;
  undefined1 auStack_8e0 [8];
  uv_loop_t uStack_8d8;
  uv_loop_t *puStack_538;
  uv_fs_t *puStack_530;
  code *pcStack_528;
  undefined8 uStack_518;
  code *pcStack_510;
  undefined1 auStack_500 [16];
  undefined1 auStack_4f0 [24];
  uint uStack_4d8;
  uint uStack_4d4;
  uint uStack_4d0;
  uv_loop_t *puStack_4c8;
  uv_loop_t *puStack_4c0;
  uv_loop_t *puStack_4b8;
  uv_loop_t *puStack_4b0;
  uv_loop_t *puStack_4a8;
  uv_loop_t *puStack_4a0;
  uv_loop_t *puStack_498;
  uv_loop_t *puStack_490;
  uv_loop_t *puStack_488;
  uv_loop_t *puStack_480;
  uv_fs_t uStack_460;
  uv_loop_t *puStack_2a0;
  uv_fs_t *puStack_298;
  size_t sStack_288;
  unsigned_long uStack_280;
  uv_loop_t *puStack_278;
  uv_fs_t *puStack_270;
  code *pcStack_268;
  undefined1 auStack_250 [8];
  uv_loop_t *puStack_248;
  undefined1 auStack_240 [16];
  anon_union_8_2_bf76bca6_for_active_reqs aStack_230;
  uv_fs_t uStack_228;
  uv_loop_t *puStack_68;
  uv_fs_t *puStack_60;
  uv__queue *local_10;
  
  loop = uv_default_loop();
  iVar5 = uv_fs_mkdtemp(loop,&mkdtemp_req1,"test_dir_XXXXXX",mkdtemp_cb);
  local_10 = (uv__queue *)(long)iVar5;
  if (local_10 == (uv__queue *)0x0) {
    uv_run(loop,UV_RUN_DEFAULT);
    local_10 = (uv__queue *)0x1;
    if (mkdtemp_cb_count != 1) goto LAB_0018c576;
    iVar5 = uv_fs_mkdtemp((uv_loop_t *)0x0,&mkdtemp_req2,"test_dir_XXXXXX",(uv_fs_cb)0x0);
    local_10 = (uv__queue *)(long)iVar5;
    if (local_10 != (uv__queue *)0x0) goto LAB_0018c583;
    check_mkdtemp_result(&mkdtemp_req2);
    unaff_RBX = (uv_loop_t *)mkdtemp_req1.path;
    local_10 = (uv__queue *)0x0;
    iVar5 = strcmp(mkdtemp_req1.path,mkdtemp_req2.path);
    if (local_10 == (uv__queue *)(long)iVar5) goto LAB_0018c590;
    rmdir((char *)unaff_RBX);
    rmdir(mkdtemp_req2.path);
    uv_fs_req_cleanup(&mkdtemp_req1);
    uv_fs_req_cleanup(&mkdtemp_req2);
    unaff_RBX = loop;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_10 = (uv__queue *)0x0;
    iVar5 = uv_loop_close(loop);
    if (local_10 == (uv__queue *)(long)iVar5) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_mkdtemp_cold_1();
LAB_0018c576:
    run_test_fs_mkdtemp_cold_2();
LAB_0018c583:
    run_test_fs_mkdtemp_cold_3();
LAB_0018c590:
    run_test_fs_mkdtemp_cold_5();
  }
  puVar9 = (uv_loop_t *)&stack0xfffffffffffffff0;
  run_test_fs_mkdtemp_cold_4();
  if (puVar9 == (uv_loop_t *)&mkdtemp_req1) {
    check_mkdtemp_result(&mkdtemp_req1);
    mkdtemp_cb_count = mkdtemp_cb_count + 1;
    return extraout_EAX;
  }
  mkdtemp_cb_cold_1();
  if (*(uv_fs_type *)(puVar9->reserved + 2) == UV_FS_MKDTEMP) {
    unaff_RBX = puVar9;
    if (puVar9->flags != 0) goto LAB_0018c75c;
    unaff_R14 = (uv_fs_t *)(puVar9->pending_queue).next;
    if (unaff_R14 == (uv_fs_t *)0x0) goto LAB_0018c76b;
    sVar8 = strlen((char *)unaff_R14);
    if (sVar8 != 0xf) goto LAB_0018c770;
    pvVar1 = unaff_R14->data;
    uVar13 = (ulong)pvVar1 >> 0x38 | ((ulong)pvVar1 & 0xff000000000000) >> 0x28 |
             ((ulong)pvVar1 & 0xff0000000000) >> 0x18 | ((ulong)pvVar1 & 0xff00000000) >> 8 |
             ((ulong)pvVar1 & 0xff000000) << 8 | ((ulong)pvVar1 & 0xff0000) << 0x18 |
             ((ulong)pvVar1 & 0xff00) << 0x28 | (long)pvVar1 << 0x38;
    if (uVar13 == 0x746573745f646972) {
      uVar6 = *(byte *)&unaff_R14->loop - 0x5f;
    }
    else {
      uVar6 = -(uint)(uVar13 < 0x746573745f646972) | 1;
    }
    if (uVar6 != 0) goto LAB_0018c77f;
    uVar6 = *(uint *)((long)&unaff_R14->loop + 1);
    uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar10 = 0x58585858;
    if (uVar6 == 0x58585858) {
      uVar4 = *(ushort *)((long)&unaff_R14->loop + 5);
      uVar6 = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
      uVar10 = 0x5858;
      uVar12 = 0;
      if (uVar6 != 0x5858) goto LAB_0018c6cf;
    }
    else {
LAB_0018c6cf:
      uVar12 = -(uint)(uVar6 < uVar10) | 1;
    }
    if (uVar12 == 0) goto LAB_0018c78e;
    check_permission((char *)unaff_R14,0x1c0);
    iVar5 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,(char *)(puVar9->pending_queue).next,(uv_fs_cb)0x0
                      );
    if (iVar5 != 0) goto LAB_0018c79d;
    if ((*(byte *)((long)stat_req.ptr + 9) & 0x40) != 0) {
      uv_fs_req_cleanup(&stat_req);
      return extraout_EAX_00;
    }
  }
  else {
    check_mkdtemp_result_cold_1();
LAB_0018c75c:
    check_mkdtemp_result_cold_2();
LAB_0018c76b:
    check_mkdtemp_result_cold_8();
LAB_0018c770:
    check_mkdtemp_result_cold_3();
LAB_0018c77f:
    check_mkdtemp_result_cold_4();
LAB_0018c78e:
    check_mkdtemp_result_cold_7();
LAB_0018c79d:
    check_mkdtemp_result_cold_5();
  }
  check_mkdtemp_result_cold_6();
  puVar9 = (uv_loop_t *)auStack_240;
  auStack_240[0] = 't';
  auStack_240[1] = 'e';
  auStack_240[2] = 's';
  auStack_240[3] = 't';
  auStack_240[4] = '_';
  auStack_240[5] = 'f';
  auStack_240[6] = 'i';
  auStack_240[7] = 'l';
  auStack_240[8] = 'e';
  auStack_240[9] = '_';
  auStack_240[10] = 'X';
  auStack_240[0xb] = 'X';
  auStack_240[0xc] = 'X';
  auStack_240[0xd] = 'X';
  auStack_240[0xe] = 'X';
  auStack_240[0xf] = 'X';
  aStack_230.count._0_1_ = 0;
  pcStack_268 = (code *)0x18c7d6;
  puStack_68 = unaff_RBX;
  puStack_60 = unaff_R14;
  loop = uv_default_loop();
  pcStack_268 = (code *)0x18c7f6;
  iVar5 = uv_fs_mkstemp(loop,&mkstemp_req1,(char *)puVar9,mkstemp_cb);
  uStack_228.data = (void *)(long)iVar5;
  auStack_250 = (undefined1  [8])0x0;
  if ((uv_loop_t *)uStack_228.data == (uv_loop_t *)0x0) {
    pcStack_268 = (code *)0x18c824;
    uv_run(loop,UV_RUN_DEFAULT);
    uStack_228.data = (uv_loop_t *)0x1;
    auStack_250 = (undefined1  [8])(long)mkstemp_cb_count;
    if (auStack_250 != (undefined1  [8])0x1) goto LAB_0018cc01;
    pcStack_268 = (code *)0x18c85e;
    iVar5 = uv_fs_mkstemp((uv_loop_t *)0x0,&mkstemp_req2,auStack_240,(uv_fs_cb)0x0);
    uStack_228.data = (void *)(long)iVar5;
    auStack_250 = (undefined1  [8])0x0;
    if ((uv_loop_t *)uStack_228.data != (uv_loop_t *)0x0) goto LAB_0018cc10;
    pcStack_268 = (code *)0x18c88a;
    check_mkstemp_result(&mkstemp_req2);
    uVar6 = (uint)mkstemp_req2.result;
    uVar14 = (uv_os_fd_t)mkstemp_req1.result;
    puVar9 = (uv_loop_t *)(ulong)(uint)mkstemp_req2.result;
    uStack_228.data = (uv_loop_t *)0x0;
    pcStack_268 = (code *)0x18c8b2;
    iVar5 = strcmp(mkstemp_req1.path,mkstemp_req2.path);
    auStack_250 = (undefined1  [8])(long)iVar5;
    if ((undefined1  [8])uStack_228.data == auStack_250) goto LAB_0018cc1f;
    uStack_228.data = (uv_loop_t *)0xffffffffffffffea;
    pcStack_268 = (code *)0x18c8e9;
    iVar5 = uv_fs_mkstemp((uv_loop_t *)0x0,&mkstemp_req3,"test_file",(uv_fs_cb)0x0);
    auStack_250 = (undefined1  [8])(long)iVar5;
    if ((undefined1  [8])uStack_228.data != auStack_250) goto LAB_0018cc2e;
    pcStack_268 = (code *)0x18c90c;
    uStack_228.data = (void *)strlen(mkstemp_req3.path);
    auStack_250 = (undefined1  [8])0x0;
    if ((uv_loop_t *)uStack_228.data != (uv_loop_t *)0x0) goto LAB_0018cc3d;
    pcStack_268 = (code *)0x18c936;
    uv_fs_req_cleanup(&mkstemp_req3);
    pcStack_268 = (code *)0x18c947;
    iov = uv_buf_init(test_buf,0xd);
    pcStack_268 = (code *)0x18c97f;
    iVar5 = uv_fs_write((uv_loop_t *)0x0,&uStack_228,uVar14,&iov,1,-1,(uv_fs_cb)0x0);
    auStack_250 = (undefined1  [8])(long)iVar5;
    puStack_248 = (uv_loop_t *)0xd;
    if (auStack_250 != (undefined1  [8])0xd) goto LAB_0018cc4c;
    auStack_250 = (undefined1  [8])uStack_228.result;
    puStack_248 = (uv_loop_t *)0xd;
    if ((uv_loop_t *)uStack_228.result != (uv_loop_t *)0xd) goto LAB_0018cc5b;
    unaff_R14 = &uStack_228;
    pcStack_268 = (code *)0x18c9d2;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_268 = (code *)0x18c9e0;
    uv_fs_close((uv_loop_t *)0x0,unaff_R14,uVar14,(uv_fs_cb)0x0);
    pcStack_268 = (code *)0x18c9e8;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_268 = (code *)0x18c9f6;
    uv_fs_close((uv_loop_t *)0x0,unaff_R14,uVar6,(uv_fs_cb)0x0);
    pcStack_268 = (code *)0x18c9fe;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_268 = (code *)0x18ca17;
    iVar5 = uv_fs_open((uv_loop_t *)0x0,unaff_R14,mkstemp_req1.path,0,0,(uv_fs_cb)0x0);
    puVar15 = (uv_loop_t *)uStack_228.result;
    auStack_250 = (undefined1  [8])(long)iVar5;
    puStack_248 = (uv_loop_t *)0x0;
    if (auStack_250 != (undefined1  [8])0x0) goto LAB_0018cc6a;
    auStack_250 = (undefined1  [8])uStack_228.result;
    puStack_248 = (uv_loop_t *)0x0;
    if (uStack_228.result < 0) goto LAB_0018cc79;
    unaff_R14 = &uStack_228;
    pcStack_268 = (code *)0x18ca6a;
    uv_fs_req_cleanup(unaff_R14);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_268 = (code *)0x18ca8c;
    uVar20 = uv_buf_init(buf,0x20);
    unaff_R15 = 0;
    pcStack_268 = (code *)0x18cac1;
    iov = uVar20;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,unaff_R14,(uv_os_fd_t)puVar15,&iov,1,-1,(uv_fs_cb)0x0);
    auStack_250 = (undefined1  [8])(long)iVar5;
    puStack_248 = (uv_loop_t *)0x0;
    if ((long)auStack_250 < 0) goto LAB_0018cc88;
    auStack_250 = (undefined1  [8])uStack_228.result;
    puStack_248 = (uv_loop_t *)0x0;
    if (uStack_228.result < 0) goto LAB_0018cc97;
    pcStack_268 = (code *)0x18cb16;
    iVar5 = strcmp(buf,test_buf);
    auStack_250 = (undefined1  [8])(long)iVar5;
    puStack_248 = (uv_loop_t *)0x0;
    if (auStack_250 != (undefined1  [8])0x0) goto LAB_0018cca6;
    pcStack_268 = (code *)0x18cb43;
    uv_fs_req_cleanup(&uStack_228);
    pcStack_268 = (code *)0x18cb51;
    uv_fs_close((uv_loop_t *)0x0,&uStack_228,(uv_os_fd_t)puVar15,(uv_fs_cb)0x0);
    pcStack_268 = (code *)0x18cb59;
    uv_fs_req_cleanup(&uStack_228);
    pcStack_268 = (code *)0x18cb6c;
    unlink(mkstemp_req1.path);
    unaff_R14 = &mkstemp_req2;
    pcStack_268 = (code *)0x18cb7f;
    unlink(mkstemp_req2.path);
    pcStack_268 = (code *)0x18cb87;
    uv_fs_req_cleanup(&mkstemp_req1);
    pcStack_268 = (code *)0x18cb8f;
    uv_fs_req_cleanup(&mkstemp_req2);
    puVar15 = loop;
    pcStack_268 = (code *)0x18cba7;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    pcStack_268 = (code *)0x18cbb1;
    uv_run(puVar15,UV_RUN_DEFAULT);
    auStack_250 = (undefined1  [8])0x0;
    pcStack_268 = (code *)0x18cbc6;
    iVar5 = uv_loop_close(loop);
    puStack_248 = (uv_loop_t *)(long)iVar5;
    if (auStack_250 == (undefined1  [8])puStack_248) {
      pcStack_268 = (code *)0x18cbe2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_268 = (code *)0x18cc01;
    run_test_fs_mkstemp_cold_1();
LAB_0018cc01:
    pcStack_268 = (code *)0x18cc10;
    run_test_fs_mkstemp_cold_2();
LAB_0018cc10:
    pcStack_268 = (code *)0x18cc1f;
    run_test_fs_mkstemp_cold_3();
LAB_0018cc1f:
    pcStack_268 = (code *)0x18cc2e;
    run_test_fs_mkstemp_cold_14();
LAB_0018cc2e:
    pcStack_268 = (code *)0x18cc3d;
    run_test_fs_mkstemp_cold_4();
LAB_0018cc3d:
    pcStack_268 = (code *)0x18cc4c;
    run_test_fs_mkstemp_cold_5();
LAB_0018cc4c:
    pcStack_268 = (code *)0x18cc5b;
    run_test_fs_mkstemp_cold_6();
LAB_0018cc5b:
    pcStack_268 = (code *)0x18cc6a;
    run_test_fs_mkstemp_cold_7();
LAB_0018cc6a:
    puVar15 = puVar9;
    pcStack_268 = (code *)0x18cc79;
    run_test_fs_mkstemp_cold_8();
LAB_0018cc79:
    pcStack_268 = (code *)0x18cc88;
    run_test_fs_mkstemp_cold_13();
LAB_0018cc88:
    pcStack_268 = (code *)0x18cc97;
    run_test_fs_mkstemp_cold_12();
LAB_0018cc97:
    pcStack_268 = (code *)0x18cca6;
    run_test_fs_mkstemp_cold_11();
LAB_0018cca6:
    pcStack_268 = (code *)0x18ccb5;
    run_test_fs_mkstemp_cold_9();
  }
  puVar9 = (uv_loop_t *)auStack_250;
  pcStack_268 = mkstemp_cb;
  run_test_fs_mkstemp_cold_10();
  if (puVar9 == (uv_loop_t *)&mkstemp_req1) {
    puStack_270 = (uv_fs_t *)0x18ccdd;
    pcStack_268._0_4_ = extraout_EAX_01;
    check_mkstemp_result(&mkstemp_req1);
    mkstemp_cb_count = mkstemp_cb_count + 1;
    return (int)pcStack_268;
  }
  puStack_270 = (uv_fs_t *)check_mkstemp_result;
  mkstemp_cb_cold_1();
  uStack_280 = (unsigned_long)*(uv_fs_type *)(puVar9->reserved + 2);
  sStack_288 = 0x23;
  puStack_278 = puVar15;
  puStack_270 = unaff_R14;
  if (uStack_280 == 0x23) {
    uStack_280 = puVar9->flags;
    sStack_288 = 0;
    if ((long)uStack_280 < 0) goto LAB_0018ce83;
    puVar17 = (uv_fs_t *)(puVar9->pending_queue).next;
    if (puVar17 == (uv_fs_t *)0x0) goto LAB_0018ce92;
    uStack_280 = 0x10;
    puStack_298 = (uv_fs_t *)0x18cd56;
    sStack_288 = strlen((char *)puVar17);
    if (uStack_280 != sStack_288) goto LAB_0018ce97;
    uVar11 = 0x746573745f66696c;
    pvVar1 = puVar17->data;
    uVar13 = (ulong)pvVar1 >> 0x38 | ((ulong)pvVar1 & 0xff000000000000) >> 0x28 |
             ((ulong)pvVar1 & 0xff0000000000) >> 0x18 | ((ulong)pvVar1 & 0xff00000000) >> 8 |
             ((ulong)pvVar1 & 0xff000000) << 8 | ((ulong)pvVar1 & 0xff0000) << 0x18 |
             ((ulong)pvVar1 & 0xff00) << 0x28 | (long)pvVar1 << 0x38;
    if (uVar13 == 0x746573745f66696c) {
      uVar4 = *(ushort *)&puVar17->loop << 8 | *(ushort *)&puVar17->loop >> 8;
      uVar13 = (ulong)uVar4;
      uVar6 = 0;
      if (uVar4 != 0x655f) {
        uVar11 = 0x655f;
        goto LAB_0018cd9a;
      }
    }
    else {
LAB_0018cd9a:
      uVar6 = -(uint)(uVar13 < uVar11) | 1;
    }
    uStack_280 = (unsigned_long)(int)uVar6;
    sStack_288 = 0;
    if (uStack_280 != 0) goto LAB_0018cea6;
    uStack_280 = 0;
    uVar6 = *(uint *)((long)&puVar17->loop + 2);
    uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar10 = 0x58585858;
    if (uVar6 == 0x58585858) {
      uVar4 = *(ushort *)((long)&puVar17->loop + 6);
      uVar6 = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
      uVar10 = 0x5858;
      uVar12 = 0;
      if (uVar6 != 0x5858) goto LAB_0018cdfa;
    }
    else {
LAB_0018cdfa:
      uVar12 = -(uint)(uVar6 < uVar10) | 1;
    }
    sStack_288 = (size_t)(int)uVar12;
    if (sStack_288 == 0) goto LAB_0018ceb5;
    puStack_298 = (uv_fs_t *)0x18ce28;
    check_permission((char *)puVar17,0x180);
    puStack_298 = (uv_fs_t *)0x18ce3c;
    iVar5 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,(char *)(puVar9->pending_queue).next,(uv_fs_cb)0x0
                      );
    uStack_280 = (unsigned_long)iVar5;
    sStack_288 = 0;
    if (uStack_280 != 0) goto LAB_0018cec4;
    if ((stat_req.statbuf.st_mode._1_1_ & 0x80) != 0) {
      uv_fs_req_cleanup(&stat_req);
      return extraout_EAX_02;
    }
  }
  else {
    puStack_298 = (uv_fs_t *)0x18ce83;
    check_mkstemp_result_cold_1();
    puVar9 = puVar15;
LAB_0018ce83:
    puStack_298 = (uv_fs_t *)0x18ce92;
    check_mkstemp_result_cold_8();
    puVar17 = unaff_R14;
LAB_0018ce92:
    puStack_298 = (uv_fs_t *)0x18ce97;
    check_mkstemp_result_cold_7();
LAB_0018ce97:
    puStack_298 = (uv_fs_t *)0x18cea6;
    check_mkstemp_result_cold_2();
LAB_0018cea6:
    puStack_298 = (uv_fs_t *)0x18ceb5;
    check_mkstemp_result_cold_3();
LAB_0018ceb5:
    puStack_298 = (uv_fs_t *)0x18cec4;
    check_mkstemp_result_cold_6();
LAB_0018cec4:
    puStack_298 = (uv_fs_t *)0x18ced3;
    check_mkstemp_result_cold_4();
  }
  puStack_298 = (uv_fs_t *)run_test_fs_fstat;
  check_mkstemp_result_cold_5();
  puVar15 = (uv_loop_t *)0x1faf2d;
  pcStack_510 = (code *)0x18cef1;
  puStack_2a0 = puVar9;
  puStack_298 = puVar17;
  unlink("test_file");
  pcStack_510 = (code *)0x18cef6;
  loop = uv_default_loop();
  pcStack_510 = (code *)0x18cf1d;
  iVar5 = uv_fs_open((uv_loop_t *)0x0,&uStack_460,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  sVar2 = uStack_460.result;
  auStack_4f0._0_8_ = SEXT48(iVar5);
  auStack_500._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_4f0._0_8_ == (uv_loop_t *)0x0) {
    auStack_4f0._0_8_ = uStack_460.result;
    auStack_500._0_8_ = (uv_loop_t *)0x0;
    puVar15 = (uv_loop_t *)uStack_460.result;
    if (uStack_460.result < 0) goto LAB_0018d58c;
    pcStack_510 = (code *)0x18cf70;
    uv_fs_req_cleanup(&uStack_460);
    puVar17 = (uv_fs_t *)auStack_4f0;
    pcStack_510 = (code *)0x18cf84;
    memset(puVar17,0,0x90);
    __fd = (int)sVar2;
    pcStack_510 = (code *)0x18cf8e;
    iVar5 = fstat64(__fd,(stat64 *)puVar17);
    auStack_500._0_8_ = SEXT48(iVar5);
    auStack_500._8_8_ = (uv_loop_t *)0x0;
    puVar15 = (uv_loop_t *)sVar2;
    if ((uv_loop_t *)auStack_500._0_8_ != (uv_loop_t *)0x0) goto LAB_0018d59b;
    pcStack_510 = (code *)0x18cfc1;
    iVar5 = uv_fs_fstat((uv_loop_t *)0x0,&uStack_460,__fd,(uv_fs_cb)0x0);
    auStack_500._0_8_ = SEXT48(iVar5);
    auStack_500._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_500._0_8_ != (uv_loop_t *)0x0) goto LAB_0018d5aa;
    auStack_500._0_8_ = uStack_460.result;
    auStack_500._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_460.result != (uv_loop_t *)0x0) goto LAB_0018d5b9;
    puVar9 = (uv_loop_t *)((uv_stat_t *)((long)uStack_460.ptr + 0x70))->st_gid;
    if ((puVar9 != (uv_loop_t *)0x0) && (puVar9 != puStack_488)) goto LAB_0018d5c8;
    puVar9 = (uv_loop_t *)(long)(int)((uv_stat_t *)((long)uStack_460.ptr + 0x70))->st_rdev;
    if ((puVar9 != (uv_loop_t *)0x0) && (puStack_480 != puVar9)) goto LAB_0018d5cd;
    pcStack_510 = (code *)0x18d054;
    uVar20 = uv_buf_init(test_buf,0xd);
    pcStack_510 = (code *)0x18d08f;
    iov = uVar20;
    iVar5 = uv_fs_write((uv_loop_t *)0x0,&uStack_460,__fd,&iov,1,-1,(uv_fs_cb)0x0);
    auStack_500._0_8_ = SEXT48(iVar5);
    auStack_500._8_8_ = (uv_loop_t *)0xd;
    if ((uv_loop_t *)auStack_500._0_8_ != (uv_loop_t *)0xd) goto LAB_0018d5d2;
    auStack_500._0_8_ = uStack_460.result;
    auStack_500._8_8_ = (uv_loop_t *)0xd;
    if ((uv_loop_t *)uStack_460.result != (uv_loop_t *)0xd) goto LAB_0018d5e1;
    puVar17 = &uStack_460;
    pcStack_510 = (code *)0x18d0e5;
    uv_fs_req_cleanup(puVar17);
    pcStack_510 = (code *)0x18d0fc;
    memset(&uStack_460.statbuf,0xaa,0xa0);
    pcStack_510 = (code *)0x18d10a;
    iVar5 = uv_fs_fstat((uv_loop_t *)0x0,puVar17,__fd,(uv_fs_cb)0x0);
    auStack_500._0_8_ = SEXT48(iVar5);
    auStack_500._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_500._0_8_ != (uv_loop_t *)0x0) goto LAB_0018d5f0;
    auStack_500._0_8_ = uStack_460.result;
    auStack_500._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_460.result != (uv_loop_t *)0x0) goto LAB_0018d5ff;
    auStack_500._0_8_ = ((void **)((long)uStack_460.ptr + 0x18))[4];
    auStack_500._8_8_ = (uv_loop_t *)0xd;
    puVar17 = (uv_fs_t *)uStack_460.ptr;
    if ((uv_loop_t *)auStack_500._0_8_ != (uv_loop_t *)0xd) goto LAB_0018d60e;
    pcStack_510 = (code *)0x18d186;
    iVar5 = fstat64(__fd,(stat64 *)auStack_4f0);
    auStack_500._0_8_ = SEXT48(iVar5);
    auStack_500._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_500._0_8_ != (uv_loop_t *)0x0) goto LAB_0018d61d;
    auStack_500._0_8_ = *(void **)uStack_460.ptr;
    auStack_500._8_8_ = auStack_4f0._0_8_;
    if (auStack_500._0_8_ != auStack_4f0._0_8_) goto LAB_0018d62c;
    auStack_500._0_8_ = *(uv_loop_t **)((long)uStack_460.ptr + 8);
    auStack_500._8_8_ = ZEXT48(uStack_4d8);
    if (auStack_500._0_8_ != auStack_500._8_8_) goto LAB_0018d63b;
    auStack_500._0_8_ = *(undefined8 *)((long)uStack_460.ptr + 0x10);
    auStack_500._8_8_ = auStack_4f0._16_8_;
    if (auStack_500._0_8_ != auStack_4f0._16_8_) goto LAB_0018d64a;
    auStack_500._0_8_ = *(void **)((long)uStack_460.ptr + 0x18);
    auStack_500._8_8_ = ZEXT48(uStack_4d4);
    if (auStack_500._0_8_ != auStack_500._8_8_) goto LAB_0018d659;
    auStack_500._0_8_ = ((void **)((long)uStack_460.ptr + 0x18))[1];
    auStack_500._8_8_ = ZEXT48(uStack_4d0);
    if (auStack_500._0_8_ != auStack_500._8_8_) goto LAB_0018d668;
    auStack_500._0_8_ = ((void **)((long)uStack_460.ptr + 0x18))[2];
    auStack_500._8_8_ = puStack_4c8;
    if ((uv_loop_t *)auStack_500._0_8_ != puStack_4c8) goto LAB_0018d677;
    auStack_500._0_8_ = ((void **)((long)uStack_460.ptr + 0x18))[3];
    auStack_500._8_8_ = auStack_4f0._8_8_;
    if (auStack_500._0_8_ != auStack_4f0._8_8_) goto LAB_0018d686;
    auStack_500._0_8_ = ((void **)((long)uStack_460.ptr + 0x18))[4];
    auStack_500._8_8_ = puStack_4c0;
    if ((uv_loop_t *)auStack_500._0_8_ != puStack_4c0) goto LAB_0018d695;
    auStack_500._0_8_ = ((void **)((long)uStack_460.ptr + 0x18))[5];
    auStack_500._8_8_ = puStack_4b8;
    if ((uv_loop_t *)auStack_500._0_8_ != puStack_4b8) goto LAB_0018d6a4;
    auStack_500._0_8_ = *(undefined8 *)((long)uStack_460.ptr + 0x48);
    auStack_500._8_8_ = puStack_4b0;
    if ((uv_loop_t *)auStack_500._0_8_ != puStack_4b0) goto LAB_0018d6b3;
    auStack_500._0_8_ = *(void **)((long)uStack_460.ptr + 0x60);
    auStack_500._8_8_ = puStack_4a8;
    if ((uv_loop_t *)auStack_500._0_8_ != puStack_4a8) goto LAB_0018d6c2;
    auStack_500._0_8_ = SEXT48(*(int *)((long)uStack_460.ptr + 0x68));
    auStack_500._8_8_ = puStack_4a0;
    if ((uv_loop_t *)auStack_500._0_8_ != puStack_4a0) goto LAB_0018d6d1;
    auStack_500._0_8_ = ((uv_stat_t *)((long)uStack_460.ptr + 0x70))->st_dev;
    auStack_500._8_8_ = puStack_498;
    if ((uv_loop_t *)auStack_500._0_8_ != puStack_498) goto LAB_0018d6e0;
    auStack_500._0_8_ = SEXT48((int)((uv_stat_t *)((long)uStack_460.ptr + 0x70))->st_mode);
    auStack_500._8_8_ = puStack_490;
    if ((uv_loop_t *)auStack_500._0_8_ != puStack_490) goto LAB_0018d6ef;
    auStack_500._0_8_ = ((uv_stat_t *)((long)uStack_460.ptr + 0x70))->st_nlink;
    auStack_500._8_8_ = puStack_488;
    if ((uv_loop_t *)auStack_500._0_8_ != puStack_488) goto LAB_0018d6fe;
    auStack_500._0_8_ = SEXT48((int)((uv_stat_t *)((long)uStack_460.ptr + 0x70))->st_uid);
    auStack_500._8_8_ = puStack_480;
    if ((uv_loop_t *)auStack_500._0_8_ != puStack_480) goto LAB_0018d70d;
    auStack_500._0_8_ = *(uv_fs_cb *)((long)uStack_460.ptr + 0x50);
    auStack_500._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_500._0_8_ != (uv_loop_t *)0x0) goto LAB_0018d71c;
    auStack_500._0_8_ = *(ssize_t *)((long)uStack_460.ptr + 0x58);
    auStack_500._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_500._0_8_ != (uv_loop_t *)0x0) goto LAB_0018d72b;
    puVar17 = &uStack_460;
    pcStack_510 = (code *)0x18d432;
    uv_fs_req_cleanup(puVar17);
    pcStack_510 = (code *)0x18d44a;
    iVar5 = uv_fs_fstat(loop,puVar17,__fd,fstat_cb);
    auStack_500._0_8_ = SEXT48(iVar5);
    auStack_500._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_500._0_8_ != (uv_loop_t *)0x0) goto LAB_0018d73a;
    pcStack_510 = (code *)0x18d478;
    uv_run(loop,UV_RUN_DEFAULT);
    auStack_500._0_8_ = (uv_loop_t *)0x1;
    auStack_500._8_8_ = SEXT48(fstat_cb_count);
    if ((uv_loop_t *)auStack_500._8_8_ != (uv_loop_t *)0x1) goto LAB_0018d749;
    pcStack_510 = (code *)0x18d4b0;
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&uStack_460,__fd,(uv_fs_cb)0x0);
    auStack_500._0_8_ = SEXT48(iVar5);
    auStack_500._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_500._0_8_ != (uv_loop_t *)0x0) goto LAB_0018d758;
    auStack_500._0_8_ = uStack_460.result;
    auStack_500._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_460.result != (uv_loop_t *)0x0) goto LAB_0018d767;
    pcStack_510 = (code *)0x18d503;
    uv_fs_req_cleanup(&uStack_460);
    pcStack_510 = (code *)0x18d511;
    uv_run(loop,UV_RUN_DEFAULT);
    pcStack_510 = (code *)0x18d51d;
    unlink("test_file");
    puVar15 = loop;
    pcStack_510 = (code *)0x18d535;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    pcStack_510 = (code *)0x18d53f;
    uv_run(puVar15,UV_RUN_DEFAULT);
    auStack_500._0_8_ = (uv_loop_t *)0x0;
    pcStack_510 = (code *)0x18d554;
    iVar5 = uv_loop_close(loop);
    auStack_500._8_8_ = SEXT48(iVar5);
    if (auStack_500._0_8_ == auStack_500._8_8_) {
      pcStack_510 = (code *)0x18d570;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_510 = (code *)0x18d58c;
    run_test_fs_fstat_cold_1();
LAB_0018d58c:
    pcStack_510 = (code *)0x18d59b;
    run_test_fs_fstat_cold_36();
LAB_0018d59b:
    pcStack_510 = (code *)0x18d5aa;
    run_test_fs_fstat_cold_2();
LAB_0018d5aa:
    pcStack_510 = (code *)0x18d5b9;
    run_test_fs_fstat_cold_3();
LAB_0018d5b9:
    pcStack_510 = (code *)0x18d5c8;
    run_test_fs_fstat_cold_4();
LAB_0018d5c8:
    pcStack_510 = (code *)0x18d5cd;
    run_test_fs_fstat_cold_5();
LAB_0018d5cd:
    pcStack_510 = (code *)0x18d5d2;
    run_test_fs_fstat_cold_6();
LAB_0018d5d2:
    pcStack_510 = (code *)0x18d5e1;
    run_test_fs_fstat_cold_7();
LAB_0018d5e1:
    pcStack_510 = (code *)0x18d5f0;
    run_test_fs_fstat_cold_8();
LAB_0018d5f0:
    pcStack_510 = (code *)0x18d5ff;
    run_test_fs_fstat_cold_9();
LAB_0018d5ff:
    pcStack_510 = (code *)0x18d60e;
    run_test_fs_fstat_cold_10();
LAB_0018d60e:
    pcStack_510 = (code *)0x18d61d;
    run_test_fs_fstat_cold_11();
LAB_0018d61d:
    pcStack_510 = (code *)0x18d62c;
    run_test_fs_fstat_cold_12();
LAB_0018d62c:
    pcStack_510 = (code *)0x18d63b;
    run_test_fs_fstat_cold_13();
LAB_0018d63b:
    pcStack_510 = (code *)0x18d64a;
    run_test_fs_fstat_cold_14();
LAB_0018d64a:
    pcStack_510 = (code *)0x18d659;
    run_test_fs_fstat_cold_15();
LAB_0018d659:
    pcStack_510 = (code *)0x18d668;
    run_test_fs_fstat_cold_16();
LAB_0018d668:
    pcStack_510 = (code *)0x18d677;
    run_test_fs_fstat_cold_17();
LAB_0018d677:
    pcStack_510 = (code *)0x18d686;
    run_test_fs_fstat_cold_18();
LAB_0018d686:
    pcStack_510 = (code *)0x18d695;
    run_test_fs_fstat_cold_19();
LAB_0018d695:
    pcStack_510 = (code *)0x18d6a4;
    run_test_fs_fstat_cold_20();
LAB_0018d6a4:
    pcStack_510 = (code *)0x18d6b3;
    run_test_fs_fstat_cold_21();
LAB_0018d6b3:
    pcStack_510 = (code *)0x18d6c2;
    run_test_fs_fstat_cold_22();
LAB_0018d6c2:
    pcStack_510 = (code *)0x18d6d1;
    run_test_fs_fstat_cold_23();
LAB_0018d6d1:
    pcStack_510 = (code *)0x18d6e0;
    run_test_fs_fstat_cold_24();
LAB_0018d6e0:
    pcStack_510 = (code *)0x18d6ef;
    run_test_fs_fstat_cold_25();
LAB_0018d6ef:
    pcStack_510 = (code *)0x18d6fe;
    run_test_fs_fstat_cold_26();
LAB_0018d6fe:
    pcStack_510 = (code *)0x18d70d;
    run_test_fs_fstat_cold_27();
LAB_0018d70d:
    pcStack_510 = (code *)0x18d71c;
    run_test_fs_fstat_cold_28();
LAB_0018d71c:
    pcStack_510 = (code *)0x18d72b;
    run_test_fs_fstat_cold_29();
LAB_0018d72b:
    pcStack_510 = (code *)0x18d73a;
    run_test_fs_fstat_cold_30();
LAB_0018d73a:
    pcStack_510 = (code *)0x18d749;
    run_test_fs_fstat_cold_31();
LAB_0018d749:
    pcStack_510 = (code *)0x18d758;
    run_test_fs_fstat_cold_32();
LAB_0018d758:
    pcStack_510 = (code *)0x18d767;
    run_test_fs_fstat_cold_33();
LAB_0018d767:
    pcStack_510 = (code *)0x18d776;
    run_test_fs_fstat_cold_34();
  }
  puVar18 = (uv_fs_t *)auStack_500;
  pcStack_510 = fstat_cb;
  run_test_fs_fstat_cold_35();
  pcStack_510 = (code *)(long)puVar18->fs_type;
  uStack_518 = 8;
  if (pcStack_510 == (code *)0x8) {
    pcStack_510 = (code *)puVar18->result;
    uStack_518 = 0;
    if (pcStack_510 != (code *)0x0) goto LAB_0018d806;
    pcStack_510 = *(code **)((long)puVar18->ptr + 0x38);
    uStack_518 = 0xd;
    if (pcStack_510 == (code *)0xd) {
      pcStack_528 = (code *)0x18d7ec;
      uv_fs_req_cleanup(puVar18);
      fstat_cb_count = fstat_cb_count + 1;
      return extraout_EAX_03;
    }
  }
  else {
    pcStack_528 = (code *)0x18d806;
    fstat_cb_cold_1();
LAB_0018d806:
    pcStack_528 = (code *)0x18d815;
    fstat_cb_cold_2();
  }
  pcStack_528 = run_test_fs_fstat_stdio;
  fstat_cb_cold_3();
  puVar18 = (uv_fs_t *)0x0;
  puVar19 = (uv__queue *)&DAT_001fbf44;
  puVar9 = (uv_loop_t *)&uStack_8d8.async_io_watcher.watcher_queue.prev;
  puStack_538 = puVar15;
  puStack_530 = puVar17;
  pcStack_528 = (code *)unaff_R15;
  do {
    uStack_8d8.async_io_watcher.pending_queue.next = (uv__queue *)0x18d84f;
    iVar5 = uv_fs_fstat((uv_loop_t *)0x0,(uv_fs_t *)puVar9,
                        *(uv_os_fd_t *)((long)&DAT_001fbf44 + (long)puVar18),(uv_fs_cb)0x0);
    uStack_8d8.async_io_watcher.watcher_queue.next = (uv__queue *)(long)iVar5;
    uStack_8d8.async_io_watcher.pending_queue.prev = (uv__queue *)0x0;
    if (uStack_8d8.async_io_watcher.watcher_queue.next != (uv__queue *)0x0) {
LAB_0018d907:
      uStack_8d8.async_io_watcher.pending_queue.next = (uv__queue *)0x18d914;
      run_test_fs_fstat_stdio_cold_1();
      goto LAB_0018d914;
    }
    uStack_8d8.async_io_watcher.watcher_queue.next = uStack_8d8.signal_io_watcher.pending_queue.prev
    ;
    uStack_8d8.async_io_watcher.pending_queue.prev = (uv__queue *)0x0;
    if (uStack_8d8.signal_io_watcher.pending_queue.prev != (uv__queue *)0x0) {
      uStack_8d8.async_io_watcher.pending_queue.next = (uv__queue *)0x18d907;
      run_test_fs_fstat_stdio_cold_2();
      goto LAB_0018d907;
    }
    uStack_8d8.async_io_watcher.pending_queue.next = (uv__queue *)0x18d892;
    uv_fs_req_cleanup((uv_fs_t *)puVar9);
    puVar18 = (uv_fs_t *)((long)&puVar18->data + 4);
  } while (puVar18 != (uv_fs_t *)0xc);
  uStack_8d8.async_io_watcher.pending_queue.next = (uv__queue *)0x18d8a1;
  puVar9 = uv_default_loop();
  uStack_8d8.async_io_watcher.pending_queue.next = (uv__queue *)0x18d8b5;
  uv_walk(puVar9,close_walk_cb,(void *)0x0);
  uStack_8d8.async_io_watcher.pending_queue.next = (uv__queue *)0x18d8bf;
  uv_run(puVar9,UV_RUN_DEFAULT);
  uStack_8d8.async_io_watcher.watcher_queue.next = (uv__queue *)0x0;
  uStack_8d8.async_io_watcher.pending_queue.next = (uv__queue *)0x18d8cd;
  puVar15 = uv_default_loop();
  uStack_8d8.async_io_watcher.pending_queue.next = (uv__queue *)0x18d8d5;
  iVar5 = uv_loop_close(puVar15);
  uStack_8d8.async_io_watcher.pending_queue.prev = (uv__queue *)(long)iVar5;
  if (uStack_8d8.async_io_watcher.watcher_queue.next ==
      uStack_8d8.async_io_watcher.pending_queue.prev) {
    uStack_8d8.async_io_watcher.pending_queue.next = (uv__queue *)0x18d8eb;
    uv_library_shutdown();
    return 0;
  }
LAB_0018d914:
  uStack_8d8.async_io_watcher.pending_queue.next = (uv__queue *)run_test_fs_access;
  run_test_fs_fstat_stdio_cold_3();
  puVar15 = (uv_loop_t *)0x1faf2d;
  pcStack_8f8 = (code *)0x18d93a;
  uStack_8d8.async_io_watcher.cb = (uv__io_cb)puVar9;
  uStack_8d8.async_io_watcher.pending_queue.next = (uv__queue *)puVar18;
  unlink("test_file");
  pcStack_8f8 = (code *)0x18d946;
  rmdir("test_dir");
  pcStack_8f8 = (code *)0x18d94b;
  loop = uv_default_loop();
  pcStack_8f8 = (code *)0x18d966;
  iVar5 = uv_fs_access((uv_loop_t *)0x0,(uv_fs_t *)(auStack_8e0 + 8),"test_file",0,(uv_fs_cb)0x0);
  auStack_8e0 = (undefined1  [8])(long)iVar5;
  puStack_8e8 = (uv_loop_t *)0x0;
  if ((long)auStack_8e0 < 0) {
    auStack_8e0 = (undefined1  [8])uStack_8d8.flags;
    puStack_8e8 = (uv_loop_t *)0x0;
    if (-1 < (long)uStack_8d8.flags) goto LAB_0018dd26;
    puVar15 = (uv_loop_t *)(auStack_8e0 + 8);
    pcStack_8f8 = (code *)0x18d9b6;
    uv_fs_req_cleanup((uv_fs_t *)puVar15);
    pcStack_8f8 = (code *)0x18d9d5;
    iVar5 = uv_fs_access(loop,(uv_fs_t *)puVar15,"test_file",0,access_cb);
    auStack_8e0 = (undefined1  [8])(long)iVar5;
    puStack_8e8 = (uv_loop_t *)0x0;
    if (auStack_8e0 != (undefined1  [8])0x0) goto LAB_0018dd35;
    pcStack_8f8 = (code *)0x18da03;
    uv_run(loop,UV_RUN_DEFAULT);
    auStack_8e0 = (undefined1  [8])0x1;
    puStack_8e8 = (uv_loop_t *)(long)access_cb_count;
    if (puStack_8e8 != (uv_loop_t *)0x1) goto LAB_0018dd44;
    access_cb_count = 0;
    pcStack_8f8 = (code *)0x18da53;
    iVar5 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(auStack_8e0 + 8),"test_file",0x42,0x180,
                       (uv_fs_cb)0x0);
    puVar9 = (uv_loop_t *)uStack_8d8.flags;
    auStack_8e0 = (undefined1  [8])(long)iVar5;
    puStack_8e8 = (uv_loop_t *)0x0;
    if (auStack_8e0 != (undefined1  [8])0x0) goto LAB_0018dd53;
    auStack_8e0 = (undefined1  [8])uStack_8d8.flags;
    puStack_8e8 = (uv_loop_t *)0x0;
    if ((long)uStack_8d8.flags < 0) goto LAB_0018dd62;
    puVar18 = (uv_fs_t *)(auStack_8e0 + 8);
    pcStack_8f8 = (code *)0x18daa3;
    uv_fs_req_cleanup(puVar18);
    pcStack_8f8 = (code *)0x18dab9;
    iVar5 = uv_fs_access((uv_loop_t *)0x0,puVar18,"test_file",0,(uv_fs_cb)0x0);
    auStack_8e0 = (undefined1  [8])(long)iVar5;
    puStack_8e8 = (uv_loop_t *)0x0;
    if (auStack_8e0 != (undefined1  [8])0x0) goto LAB_0018dd71;
    auStack_8e0 = (undefined1  [8])uStack_8d8.flags;
    puStack_8e8 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_8d8.flags != (uv_loop_t *)0x0) goto LAB_0018dd80;
    puVar18 = (uv_fs_t *)(auStack_8e0 + 8);
    pcStack_8f8 = (code *)0x18db09;
    uv_fs_req_cleanup(puVar18);
    pcStack_8f8 = (code *)0x18db28;
    iVar5 = uv_fs_access(loop,puVar18,"test_file",0,access_cb);
    auStack_8e0 = (undefined1  [8])(long)iVar5;
    puStack_8e8 = (uv_loop_t *)0x0;
    if (auStack_8e0 != (undefined1  [8])0x0) goto LAB_0018dd8f;
    pcStack_8f8 = (code *)0x18db56;
    uv_run(loop,UV_RUN_DEFAULT);
    auStack_8e0 = (undefined1  [8])0x1;
    puStack_8e8 = (uv_loop_t *)(long)access_cb_count;
    if (puStack_8e8 != (uv_loop_t *)0x1) goto LAB_0018dd9e;
    access_cb_count = 0;
    pcStack_8f8 = (code *)0x18db95;
    iVar5 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)(auStack_8e0 + 8),(uv_os_fd_t)puVar9,
                        (uv_fs_cb)0x0);
    auStack_8e0 = (undefined1  [8])(long)iVar5;
    puStack_8e8 = (uv_loop_t *)0x0;
    if (auStack_8e0 != (undefined1  [8])0x0) goto LAB_0018ddad;
    auStack_8e0 = (undefined1  [8])uStack_8d8.flags;
    puStack_8e8 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_8d8.flags != (uv_loop_t *)0x0) goto LAB_0018ddbc;
    puVar9 = (uv_loop_t *)(auStack_8e0 + 8);
    pcStack_8f8 = (code *)0x18dbe5;
    uv_fs_req_cleanup((uv_fs_t *)puVar9);
    pcStack_8f8 = (code *)0x18dbfe;
    iVar5 = uv_fs_mkdir((uv_loop_t *)0x0,(uv_fs_t *)puVar9,"test_dir",0x1ff,(uv_fs_cb)0x0);
    auStack_8e0 = (undefined1  [8])(long)iVar5;
    puStack_8e8 = (uv_loop_t *)0x0;
    if (auStack_8e0 != (undefined1  [8])0x0) goto LAB_0018ddcb;
    puVar9 = (uv_loop_t *)(auStack_8e0 + 8);
    pcStack_8f8 = (code *)0x18dc2b;
    uv_fs_req_cleanup((uv_fs_t *)puVar9);
    pcStack_8f8 = (code *)0x18dc44;
    iVar5 = uv_fs_access((uv_loop_t *)0x0,(uv_fs_t *)puVar9,"test_dir",2,(uv_fs_cb)0x0);
    auStack_8e0 = (undefined1  [8])(long)iVar5;
    puStack_8e8 = (uv_loop_t *)0x0;
    if (auStack_8e0 != (undefined1  [8])0x0) goto LAB_0018ddda;
    auStack_8e0 = (undefined1  [8])uStack_8d8.flags;
    puStack_8e8 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_8d8.flags != (uv_loop_t *)0x0) goto LAB_0018dde9;
    pcStack_8f8 = (code *)0x18dc91;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_8e0 + 8));
    pcStack_8f8 = (code *)0x18dc9f;
    uv_run(loop,UV_RUN_DEFAULT);
    pcStack_8f8 = (code *)0x18dcab;
    unlink("test_file");
    pcStack_8f8 = (code *)0x18dcb7;
    rmdir("test_dir");
    puVar9 = loop;
    pcStack_8f8 = (code *)0x18dccf;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    pcStack_8f8 = (code *)0x18dcd9;
    uv_run(puVar9,UV_RUN_DEFAULT);
    auStack_8e0 = (undefined1  [8])0x0;
    pcStack_8f8 = (code *)0x18dcee;
    iVar5 = uv_loop_close(loop);
    puStack_8e8 = (uv_loop_t *)(long)iVar5;
    if (auStack_8e0 == (undefined1  [8])puStack_8e8) {
      pcStack_8f8 = (code *)0x18dd0a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_8f8 = (code *)0x18dd26;
    run_test_fs_access_cold_1();
LAB_0018dd26:
    pcStack_8f8 = (code *)0x18dd35;
    run_test_fs_access_cold_2();
LAB_0018dd35:
    pcStack_8f8 = (code *)0x18dd44;
    run_test_fs_access_cold_3();
LAB_0018dd44:
    pcStack_8f8 = (code *)0x18dd53;
    run_test_fs_access_cold_4();
LAB_0018dd53:
    puVar9 = puVar15;
    pcStack_8f8 = (code *)0x18dd62;
    run_test_fs_access_cold_5();
LAB_0018dd62:
    pcStack_8f8 = (code *)0x18dd71;
    run_test_fs_access_cold_16();
LAB_0018dd71:
    pcStack_8f8 = (code *)0x18dd80;
    run_test_fs_access_cold_6();
LAB_0018dd80:
    pcStack_8f8 = (code *)0x18dd8f;
    run_test_fs_access_cold_7();
LAB_0018dd8f:
    pcStack_8f8 = (code *)0x18dd9e;
    run_test_fs_access_cold_8();
LAB_0018dd9e:
    pcStack_8f8 = (code *)0x18ddad;
    run_test_fs_access_cold_9();
LAB_0018ddad:
    pcStack_8f8 = (code *)0x18ddbc;
    run_test_fs_access_cold_10();
LAB_0018ddbc:
    pcStack_8f8 = (code *)0x18ddcb;
    run_test_fs_access_cold_11();
LAB_0018ddcb:
    pcStack_8f8 = (code *)0x18ddda;
    run_test_fs_access_cold_12();
LAB_0018ddda:
    pcStack_8f8 = (code *)0x18dde9;
    run_test_fs_access_cold_13();
LAB_0018dde9:
    pcStack_8f8 = (code *)0x18ddf8;
    run_test_fs_access_cold_14();
  }
  puVar17 = (uv_fs_t *)auStack_8e0;
  pcStack_8f8 = access_cb;
  run_test_fs_access_cold_15();
  pcStack_8f8 = (code *)(long)puVar17->fs_type;
  uStack_900 = 0xc;
  if (pcStack_8f8 == (code *)0xc) {
    access_cb_count = access_cb_count + 1;
    uv_fs_req_cleanup(puVar17);
    return extraout_EAX_04;
  }
  pcStack_910 = run_test_fs_chmod;
  access_cb_cold_1();
  pcStack_910 = (code *)&DAT_001fbf44;
  puVar15 = (uv_loop_t *)0x1faf2d;
  puStack_b08 = (uv_loop_t *)0x18de62;
  puStack_920 = puVar9;
  puStack_918 = puVar18;
  unlink("test_file");
  puStack_b08 = (uv_loop_t *)0x18de67;
  loop = uv_default_loop();
  puStack_b08 = (uv_loop_t *)0x18de8b;
  iVar5 = uv_fs_open((uv_loop_t *)0x0,&uStack_ae0,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  sVar2 = uStack_ae0.result;
  puStack_ae8 = (uv_loop_t *)(long)iVar5;
  puStack_af0 = (uv_loop_t *)0x0;
  if (puStack_ae8 == (uv_loop_t *)0x0) {
    puStack_ae8 = (uv_loop_t *)uStack_ae0.result;
    puStack_af0 = (uv_loop_t *)0x0;
    puVar15 = (uv_loop_t *)uStack_ae0.result;
    if (uStack_ae0.result < 0) goto LAB_0018e318;
    puVar18 = &uStack_ae0;
    puStack_b08 = (uv_loop_t *)0x18dedb;
    uv_fs_req_cleanup(puVar18);
    puStack_b08 = (uv_loop_t *)0x18deec;
    uVar20 = uv_buf_init(test_buf,0xd);
    uVar14 = (uv_os_fd_t)sVar2;
    puStack_b08 = (uv_loop_t *)0x18df22;
    iov = uVar20;
    iVar5 = uv_fs_write((uv_loop_t *)0x0,puVar18,uVar14,&iov,1,-1,(uv_fs_cb)0x0);
    puStack_ae8 = (uv_loop_t *)(long)iVar5;
    puStack_af0 = (uv_loop_t *)0xd;
    puVar15 = (uv_loop_t *)sVar2;
    if (puStack_ae8 != (uv_loop_t *)0xd) goto LAB_0018e327;
    puStack_ae8 = (uv_loop_t *)uStack_ae0.result;
    puStack_af0 = (uv_loop_t *)0xd;
    if ((uv_loop_t *)uStack_ae0.result != (uv_loop_t *)0xd) goto LAB_0018e336;
    puVar18 = &uStack_ae0;
    puStack_b08 = (uv_loop_t *)0x18df72;
    uv_fs_req_cleanup(puVar18);
    puStack_b08 = (uv_loop_t *)0x18df8b;
    iVar5 = uv_fs_chmod((uv_loop_t *)0x0,puVar18,"test_file",0x80,(uv_fs_cb)0x0);
    puStack_ae8 = (uv_loop_t *)(long)iVar5;
    puStack_af0 = (uv_loop_t *)0x0;
    if (puStack_ae8 != (uv_loop_t *)0x0) goto LAB_0018e345;
    puStack_ae8 = (uv_loop_t *)uStack_ae0.result;
    puStack_af0 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_ae0.result != (uv_loop_t *)0x0) goto LAB_0018e354;
    puVar18 = &uStack_ae0;
    puStack_b08 = (uv_loop_t *)0x18dfdb;
    uv_fs_req_cleanup(puVar18);
    puVar19 = (uv__queue *)0x1faf2d;
    puStack_b08 = (uv_loop_t *)0x18dfef;
    check_permission("test_file",0x80);
    puStack_b08 = (uv_loop_t *)0x18e004;
    iVar5 = uv_fs_chmod((uv_loop_t *)0x0,puVar18,"test_file",0x100,(uv_fs_cb)0x0);
    puStack_ae8 = (uv_loop_t *)(long)iVar5;
    puStack_af0 = (uv_loop_t *)0x0;
    if (puStack_ae8 != (uv_loop_t *)0x0) goto LAB_0018e363;
    puStack_ae8 = (uv_loop_t *)uStack_ae0.result;
    puStack_af0 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_ae0.result != (uv_loop_t *)0x0) goto LAB_0018e372;
    puVar18 = &uStack_ae0;
    puStack_b08 = (uv_loop_t *)0x18e054;
    uv_fs_req_cleanup(puVar18);
    puStack_b08 = (uv_loop_t *)0x18e065;
    check_permission("test_file",0x100);
    puStack_b08 = (uv_loop_t *)0x18e079;
    iVar5 = uv_fs_fchmod((uv_loop_t *)0x0,puVar18,uVar14,0x180,(uv_fs_cb)0x0);
    puStack_ae8 = (uv_loop_t *)(long)iVar5;
    puStack_af0 = (uv_loop_t *)0x0;
    if (puStack_ae8 != (uv_loop_t *)0x0) goto LAB_0018e381;
    puStack_ae8 = (uv_loop_t *)uStack_ae0.result;
    puStack_af0 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_ae0.result != (uv_loop_t *)0x0) goto LAB_0018e390;
    puVar18 = &uStack_ae0;
    puStack_b08 = (uv_loop_t *)0x18e0c9;
    uv_fs_req_cleanup(puVar18);
    puVar19 = (uv__queue *)0x1faf2d;
    puStack_b08 = (uv_loop_t *)0x18e0dd;
    check_permission("test_file",0x180);
    uStack_ae0.data = &run_test_fs_chmod::mode;
    puStack_b08 = (uv_loop_t *)0x18e105;
    iVar5 = uv_fs_chmod(loop,puVar18,"test_file",0x80,chmod_cb);
    puStack_ae8 = (uv_loop_t *)(long)iVar5;
    puStack_af0 = (uv_loop_t *)0x0;
    if (puStack_ae8 != (uv_loop_t *)0x0) goto LAB_0018e39f;
    puStack_b08 = (uv_loop_t *)0x18e133;
    uv_run(loop,UV_RUN_DEFAULT);
    puStack_ae8 = (uv_loop_t *)0x1;
    puStack_af0 = (uv_loop_t *)(long)chmod_cb_count;
    if (puStack_af0 != (uv_loop_t *)0x1) goto LAB_0018e3ae;
    chmod_cb_count = 0;
    uStack_ae0.data = &run_test_fs_chmod::mode_1;
    puStack_b08 = (uv_loop_t *)0x18e190;
    iVar5 = uv_fs_chmod(loop,&uStack_ae0,"test_file",0x100,chmod_cb);
    puStack_ae8 = (uv_loop_t *)(long)iVar5;
    puStack_af0 = (uv_loop_t *)0x0;
    if (puStack_ae8 != (uv_loop_t *)0x0) goto LAB_0018e3bd;
    puStack_b08 = (uv_loop_t *)0x18e1be;
    uv_run(loop,UV_RUN_DEFAULT);
    puStack_ae8 = (uv_loop_t *)0x1;
    puStack_af0 = (uv_loop_t *)(long)chmod_cb_count;
    if (puStack_af0 != (uv_loop_t *)0x1) goto LAB_0018e3cc;
    uStack_ae0.data = &run_test_fs_chmod::mode_2;
    puStack_b08 = (uv_loop_t *)0x18e20c;
    iVar5 = uv_fs_fchmod(loop,&uStack_ae0,uVar14,0x180,fchmod_cb);
    puStack_ae8 = (uv_loop_t *)(long)iVar5;
    puStack_af0 = (uv_loop_t *)0x0;
    if (puStack_ae8 != (uv_loop_t *)0x0) goto LAB_0018e3db;
    puStack_b08 = (uv_loop_t *)0x18e23a;
    uv_run(loop,UV_RUN_DEFAULT);
    puStack_ae8 = (uv_loop_t *)0x1;
    puStack_af0 = (uv_loop_t *)(long)fchmod_cb_count;
    if (puStack_af0 != (uv_loop_t *)0x1) goto LAB_0018e3ea;
    puStack_b08 = (uv_loop_t *)0x18e26f;
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&uStack_ae0,uVar14,(uv_fs_cb)0x0);
    if (iVar5 != 0) goto LAB_0018e3f9;
    if ((uv_loop_t *)uStack_ae0.result != (uv_loop_t *)0x0) goto LAB_0018e3fe;
    puStack_b08 = (uv_loop_t *)0x18e28d;
    uv_fs_req_cleanup(&uStack_ae0);
    puStack_b08 = (uv_loop_t *)0x18e29b;
    uv_run(loop,UV_RUN_DEFAULT);
    puStack_b08 = (uv_loop_t *)0x18e2a7;
    unlink("test_file");
    puVar15 = loop;
    puStack_b08 = (uv_loop_t *)0x18e2bf;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    puStack_b08 = (uv_loop_t *)0x18e2c9;
    uv_run(puVar15,UV_RUN_DEFAULT);
    puStack_ae8 = (uv_loop_t *)0x0;
    puStack_b08 = (uv_loop_t *)0x18e2de;
    iVar5 = uv_loop_close(loop);
    puStack_af0 = (uv_loop_t *)(long)iVar5;
    if (puStack_ae8 == puStack_af0) {
      puStack_b08 = (uv_loop_t *)0x18e2fa;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_b08 = (uv_loop_t *)0x18e318;
    run_test_fs_chmod_cold_1();
LAB_0018e318:
    puStack_b08 = (uv_loop_t *)0x18e327;
    run_test_fs_chmod_cold_19();
LAB_0018e327:
    puStack_b08 = (uv_loop_t *)0x18e336;
    run_test_fs_chmod_cold_2();
LAB_0018e336:
    puStack_b08 = (uv_loop_t *)0x18e345;
    run_test_fs_chmod_cold_3();
LAB_0018e345:
    puStack_b08 = (uv_loop_t *)0x18e354;
    run_test_fs_chmod_cold_4();
LAB_0018e354:
    puStack_b08 = (uv_loop_t *)0x18e363;
    run_test_fs_chmod_cold_5();
LAB_0018e363:
    puStack_b08 = (uv_loop_t *)0x18e372;
    run_test_fs_chmod_cold_6();
LAB_0018e372:
    puStack_b08 = (uv_loop_t *)0x18e381;
    run_test_fs_chmod_cold_7();
LAB_0018e381:
    puStack_b08 = (uv_loop_t *)0x18e390;
    run_test_fs_chmod_cold_8();
LAB_0018e390:
    puStack_b08 = (uv_loop_t *)0x18e39f;
    run_test_fs_chmod_cold_9();
LAB_0018e39f:
    puStack_b08 = (uv_loop_t *)0x18e3ae;
    run_test_fs_chmod_cold_10();
LAB_0018e3ae:
    puStack_b08 = (uv_loop_t *)0x18e3bd;
    run_test_fs_chmod_cold_11();
LAB_0018e3bd:
    puStack_b08 = (uv_loop_t *)0x18e3cc;
    run_test_fs_chmod_cold_12();
LAB_0018e3cc:
    puStack_b08 = (uv_loop_t *)0x18e3db;
    run_test_fs_chmod_cold_13();
LAB_0018e3db:
    puStack_b08 = (uv_loop_t *)0x18e3ea;
    run_test_fs_chmod_cold_14();
LAB_0018e3ea:
    puStack_b08 = (uv_loop_t *)0x18e3f9;
    run_test_fs_chmod_cold_15();
LAB_0018e3f9:
    puStack_b08 = (uv_loop_t *)0x18e3fe;
    run_test_fs_chmod_cold_16();
LAB_0018e3fe:
    puStack_b08 = (uv_loop_t *)0x18e403;
    run_test_fs_chmod_cold_17();
  }
  path = &puStack_ae8;
  ppuVar16 = &puStack_af0;
  puStack_b08 = (uv_loop_t *)check_permission;
  run_test_fs_chmod_cold_18();
  puVar9 = (uv_loop_t *)((ulong)ppuVar16 & 0xffffffff);
  uStack_ce0._0_4_ = 0x18e42d;
  uStack_ce0._4_4_ = 0;
  puStack_b08 = puVar15;
  iVar5 = uv_fs_stat((uv_loop_t *)0x0,&uStack_cc8,(char *)path,(uv_fs_cb)0x0);
  puStack_cd0 = (uv_loop_t *)(long)iVar5;
  puStack_cd8 = (uv_loop_t *)0x0;
  if (puStack_cd0 == (uv_loop_t *)0x0) {
    puStack_cd0 = (uv_loop_t *)uStack_cc8.result;
    puStack_cd8 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_cc8.result != (uv_loop_t *)0x0) goto LAB_0018e4a7;
    puStack_cd0 = (uv_loop_t *)(ulong)((uint)uStack_cc8.statbuf.st_mode & 0x1ff);
    puStack_cd8 = puVar9;
    if (puStack_cd0 == puVar9) {
      uStack_ce0._0_4_ = 0x18e491;
      uStack_ce0._4_4_ = 0;
      uv_fs_req_cleanup(&uStack_cc8);
      return extraout_EAX_05;
    }
  }
  else {
    uStack_ce0._0_4_ = 0x18e4a7;
    uStack_ce0._4_4_ = 0;
    check_permission_cold_1();
LAB_0018e4a7:
    uStack_ce0._0_4_ = 0x18e4b4;
    uStack_ce0._4_4_ = 0;
    check_permission_cold_2();
  }
  puVar15 = (uv_loop_t *)&puStack_cd0;
  uStack_ce0 = chmod_cb;
  check_permission_cold_3();
  auStack_ed8._496_8_ = SEXT48(*(uv_fs_type *)(puVar15->reserved + 2));
  auStack_ed8._488_4_ = 0xd;
  auStack_ed8._492_4_ = 0;
  uStack_ce0 = (code *)puVar9;
  if (auStack_ed8._496_8_ == 0xd) {
    auStack_ed8._496_8_ = puVar15->flags;
    auStack_ed8._488_4_ = 0;
    auStack_ed8._492_4_ = 0;
    if (auStack_ed8._496_8_ == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      auStack_ed8._480_8_ = (uv__queue *)0x18e50f;
      uv_fs_req_cleanup((uv_fs_t *)puVar15);
      check_permission("test_file",*puVar15->data);
      return extraout_EAX_06;
    }
  }
  else {
    auStack_ed8._480_8_ = (uv__queue *)0x18e532;
    chmod_cb_cold_1();
    puVar15 = puVar9;
  }
  puVar9 = (uv_loop_t *)(auStack_ed8 + 0x1f0);
  auStack_ed8._480_8_ = fchmod_cb;
  chmod_cb_cold_2();
  auStack_ed8._472_8_ = SEXT48(*(uv_fs_type *)(puVar9->reserved + 2));
  auStack_ed8._464_8_ = (uv__queue *)0xe;
  auStack_ed8._480_8_ = puVar15;
  if ((uv__queue *)auStack_ed8._472_8_ == (uv__queue *)0xe) {
    auStack_ed8._472_8_ = puVar9->flags;
    auStack_ed8._464_8_ = (uv__queue *)0x0;
    auStack_ed8._448_8_ = puVar9;
    if ((uv__queue *)auStack_ed8._472_8_ == (uv__queue *)0x0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      auStack_ed8._456_8_ = (uv__queue *)0x18e58d;
      uv_fs_req_cleanup((uv_fs_t *)puVar9);
      check_permission("test_file",*puVar9->data);
      return extraout_EAX_07;
    }
  }
  else {
    auStack_ed8._456_8_ = (uv__queue *)0x18e5b0;
    fchmod_cb_cold_1();
    auStack_ed8._448_8_ = puVar15;
  }
  auStack_ed8._456_8_ = run_test_fs_unlink_readonly;
  fchmod_cb_cold_2();
  puVar9 = (uv_loop_t *)0x1faf2d;
  puStack_ef8 = (uv_fs_t *)0x18e5d6;
  auStack_ed8._456_8_ = puVar18;
  unlink("test_file");
  puStack_ef8 = (uv_fs_t *)0x18e5db;
  loop = uv_default_loop();
  puStack_ef8 = (uv_fs_t *)0x18e5ff;
  iVar5 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_ed8,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar3 = auStack_ed8._88_8_;
  if (iVar5 == 0) {
    puVar9 = (uv_loop_t *)auStack_ed8._88_8_;
    if ((long)auStack_ed8._88_8_ < 0) goto LAB_0018e89a;
    puVar18 = (uv_fs_t *)auStack_ed8;
    puStack_ef8 = (uv_fs_t *)0x18e64f;
    uv_fs_req_cleanup(puVar18);
    puStack_ef8 = (uv_fs_t *)0x18e660;
    uVar20 = uv_buf_init(test_buf,0xd);
    puStack_ef8 = (uv_fs_t *)0x18e696;
    iov = uVar20;
    iVar5 = uv_fs_write((uv_loop_t *)0x0,puVar18,(uv_os_fd_t)uVar3,&iov,1,-1,(uv_fs_cb)0x0);
    puVar9 = (uv_loop_t *)uVar3;
    if (iVar5 != 0xd) goto LAB_0018e8a9;
    if ((uv_loop_t *)auStack_ed8._88_8_ != (uv_loop_t *)0xd) goto LAB_0018e8b8;
    puVar18 = (uv_fs_t *)auStack_ed8;
    puStack_ef8 = (uv_fs_t *)0x18e6e6;
    uv_fs_req_cleanup(puVar18);
    puStack_ef8 = (uv_fs_t *)0x18e6f4;
    iVar5 = uv_fs_close((uv_loop_t *)0x0,puVar18,(uv_os_fd_t)uVar3,(uv_fs_cb)0x0);
    if (iVar5 != 0) goto LAB_0018e8c7;
    if ((uv_loop_t *)auStack_ed8._88_8_ != (uv_loop_t *)0x0) goto LAB_0018e8cc;
    puVar9 = (uv_loop_t *)auStack_ed8;
    puStack_ef8 = (uv_fs_t *)0x18e715;
    uv_fs_req_cleanup((uv_fs_t *)puVar9);
    puStack_ef8 = (uv_fs_t *)0x18e72e;
    iVar5 = uv_fs_chmod((uv_loop_t *)0x0,(uv_fs_t *)puVar9,"test_file",0x100,(uv_fs_cb)0x0);
    if (iVar5 != 0) goto LAB_0018e8d1;
    if ((uv_loop_t *)auStack_ed8._88_8_ != (uv_loop_t *)0x0) goto LAB_0018e8e0;
    puVar9 = (uv_loop_t *)auStack_ed8;
    puStack_ef8 = (uv_fs_t *)0x18e77e;
    uv_fs_req_cleanup((uv_fs_t *)puVar9);
    puVar18 = (uv_fs_t *)0x1faf2d;
    puStack_ef8 = (uv_fs_t *)0x18e792;
    check_permission("test_file",0x100);
    puStack_ef8 = (uv_fs_t *)0x18e7a1;
    iVar5 = uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)puVar9,"test_file",(uv_fs_cb)0x0);
    if (iVar5 != 0) goto LAB_0018e8ef;
    if ((uv_loop_t *)auStack_ed8._88_8_ != (uv_loop_t *)0x0) goto LAB_0018e8fe;
    puStack_ef8 = (uv_fs_t *)0x18e7f1;
    uv_fs_req_cleanup((uv_fs_t *)auStack_ed8);
    puStack_ef8 = (uv_fs_t *)0x18e7ff;
    uv_run(loop,UV_RUN_DEFAULT);
    puVar18 = (uv_fs_t *)0x1faf2d;
    puStack_ef8 = (uv_fs_t *)0x18e81b;
    uv_fs_chmod((uv_loop_t *)0x0,(uv_fs_t *)auStack_ed8,"test_file",0x180,(uv_fs_cb)0x0);
    puStack_ef8 = (uv_fs_t *)0x18e823;
    uv_fs_req_cleanup((uv_fs_t *)auStack_ed8);
    puStack_ef8 = (uv_fs_t *)0x18e82b;
    unlink("test_file");
    puVar9 = loop;
    puStack_ef8 = (uv_fs_t *)0x18e843;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    puStack_ef8 = (uv_fs_t *)0x18e84d;
    uv_run(puVar9,UV_RUN_DEFAULT);
    puStack_ef8 = (uv_fs_t *)0x18e862;
    iVar5 = uv_loop_close(loop);
    if (iVar5 == 0) {
      puStack_ef8 = (uv_fs_t *)0x18e87e;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_ef8 = (uv_fs_t *)0x18e89a;
    run_test_fs_unlink_readonly_cold_1();
LAB_0018e89a:
    puStack_ef8 = (uv_fs_t *)0x18e8a9;
    run_test_fs_unlink_readonly_cold_11();
LAB_0018e8a9:
    puStack_ef8 = (uv_fs_t *)0x18e8b8;
    run_test_fs_unlink_readonly_cold_2();
LAB_0018e8b8:
    puStack_ef8 = (uv_fs_t *)0x18e8c7;
    run_test_fs_unlink_readonly_cold_3();
LAB_0018e8c7:
    puStack_ef8 = (uv_fs_t *)0x18e8cc;
    run_test_fs_unlink_readonly_cold_4();
LAB_0018e8cc:
    puStack_ef8 = (uv_fs_t *)0x18e8d1;
    run_test_fs_unlink_readonly_cold_5();
LAB_0018e8d1:
    puStack_ef8 = (uv_fs_t *)0x18e8e0;
    run_test_fs_unlink_readonly_cold_6();
LAB_0018e8e0:
    puStack_ef8 = (uv_fs_t *)0x18e8ef;
    run_test_fs_unlink_readonly_cold_7();
LAB_0018e8ef:
    puStack_ef8 = (uv_fs_t *)0x18e8fe;
    run_test_fs_unlink_readonly_cold_8();
LAB_0018e8fe:
    puStack_ef8 = (uv_fs_t *)0x18e90d;
    run_test_fs_unlink_readonly_cold_9();
  }
  puStack_ef8 = (uv_fs_t *)run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_10();
  puVar15 = (uv_loop_t *)0x1faf2d;
  auStack_1100._32_8_ = (uv__queue *)0x18e935;
  puStack_f00 = puVar9;
  puStack_ef8 = puVar18;
  unlink("test_file");
  auStack_1100._32_8_ = (uv__queue *)0x18e941;
  unlink("test_file_link");
  auStack_1100._32_8_ = (uv__queue *)0x18e946;
  loop = uv_default_loop();
  auStack_1100._32_8_ = (uv__queue *)0x18e96a;
  iVar5 = uv_fs_open((uv_loop_t *)0x0,&uStack_10c0,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  sVar2 = uStack_10c0.result;
  auStack_1100._56_8_ = SEXT48(iVar5);
  auStack_1100._48_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_1100._56_8_ == (uv_loop_t *)0x0) {
    auStack_1100._56_8_ = uStack_10c0.result;
    auStack_1100._48_8_ = (uv_loop_t *)0x0;
    puVar15 = (uv_loop_t *)uStack_10c0.result;
    if (uStack_10c0.result < 0) goto LAB_0018ee50;
    puVar18 = &uStack_10c0;
    auStack_1100._32_8_ = (uv__queue *)0x18e9ba;
    uv_fs_req_cleanup(puVar18);
    auStack_1100._32_8_ = (uv__queue *)0x18e9d9;
    iVar5 = uv_fs_chown((uv_loop_t *)0x0,puVar18,"test_file",0xffffffff,0xffffffff,(uv_fs_cb)0x0);
    auStack_1100._56_8_ = SEXT48(iVar5);
    auStack_1100._48_8_ = (uv_loop_t *)0x0;
    puVar15 = (uv_loop_t *)sVar2;
    if ((uv_loop_t *)auStack_1100._56_8_ != (uv_loop_t *)0x0) goto LAB_0018ee5f;
    auStack_1100._56_8_ = uStack_10c0.result;
    auStack_1100._48_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_10c0.result != (uv_loop_t *)0x0) goto LAB_0018ee6e;
    puVar18 = &uStack_10c0;
    auStack_1100._32_8_ = (uv__queue *)0x18ea29;
    uv_fs_req_cleanup(puVar18);
    uVar14 = (uv_os_fd_t)sVar2;
    auStack_1100._32_8_ = (uv__queue *)0x18ea43;
    iVar5 = uv_fs_fchown((uv_loop_t *)0x0,puVar18,uVar14,0xffffffff,0xffffffff,(uv_fs_cb)0x0);
    auStack_1100._56_8_ = SEXT48(iVar5);
    auStack_1100._48_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1100._56_8_ != (uv_loop_t *)0x0) goto LAB_0018ee7d;
    auStack_1100._56_8_ = uStack_10c0.result;
    auStack_1100._48_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_10c0.result != (uv_loop_t *)0x0) goto LAB_0018ee8c;
    puVar18 = &uStack_10c0;
    auStack_1100._32_8_ = (uv__queue *)0x18ea93;
    uv_fs_req_cleanup(puVar18);
    auStack_1100._32_8_ = (uv__queue *)0x18eabb;
    iVar5 = uv_fs_chown(loop,puVar18,"test_file",0xffffffff,0xffffffff,chown_cb);
    auStack_1100._56_8_ = SEXT48(iVar5);
    auStack_1100._48_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1100._56_8_ != (uv_loop_t *)0x0) goto LAB_0018ee9b;
    auStack_1100._32_8_ = (uv__queue *)0x18eae9;
    uv_run(loop,UV_RUN_DEFAULT);
    auStack_1100._56_8_ = (uv_loop_t *)0x1;
    auStack_1100._48_8_ = SEXT48(chown_cb_count);
    if ((uv_loop_t *)auStack_1100._48_8_ != (uv_loop_t *)0x1) goto LAB_0018eeaa;
    chown_cb_count = 0;
    auStack_1100._32_8_ = (uv__queue *)0x18eb3c;
    iVar5 = uv_fs_chown(loop,&uStack_10c0,"test_file",0,0,chown_root_cb);
    auStack_1100._56_8_ = SEXT48(iVar5);
    auStack_1100._48_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1100._56_8_ != (uv_loop_t *)0x0) goto LAB_0018eeb9;
    auStack_1100._32_8_ = (uv__queue *)0x18eb6a;
    uv_run(loop,UV_RUN_DEFAULT);
    auStack_1100._56_8_ = (uv_loop_t *)0x1;
    auStack_1100._48_8_ = SEXT48(chown_cb_count);
    if ((uv_loop_t *)auStack_1100._48_8_ != (uv_loop_t *)0x1) goto LAB_0018eec8;
    auStack_1100._32_8_ = (uv__queue *)0x18ebb4;
    iVar5 = uv_fs_fchown(loop,&uStack_10c0,uVar14,0xffffffff,0xffffffff,fchown_cb);
    auStack_1100._56_8_ = SEXT48(iVar5);
    auStack_1100._48_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1100._56_8_ != (uv_loop_t *)0x0) goto LAB_0018eed7;
    auStack_1100._32_8_ = (uv__queue *)0x18ebe2;
    uv_run(loop,UV_RUN_DEFAULT);
    auStack_1100._56_8_ = (uv_loop_t *)0x1;
    auStack_1100._48_8_ = SEXT48(fchown_cb_count);
    if ((uv_loop_t *)auStack_1100._48_8_ != (uv_loop_t *)0x1) goto LAB_0018eee6;
    auStack_1100._32_8_ = (uv__queue *)0x18ec24;
    iVar5 = uv_fs_link((uv_loop_t *)0x0,&uStack_10c0,"test_file","test_file_link",(uv_fs_cb)0x0);
    auStack_1100._56_8_ = SEXT48(iVar5);
    auStack_1100._48_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1100._56_8_ != (uv_loop_t *)0x0) goto LAB_0018eef5;
    auStack_1100._56_8_ = uStack_10c0.result;
    auStack_1100._48_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_10c0.result != (uv_loop_t *)0x0) goto LAB_0018ef04;
    puVar18 = &uStack_10c0;
    auStack_1100._32_8_ = (uv__queue *)0x18ec74;
    uv_fs_req_cleanup(puVar18);
    auStack_1100._32_8_ = (uv__queue *)0x18ec93;
    iVar5 = uv_fs_lchown((uv_loop_t *)0x0,puVar18,"test_file_link",0xffffffff,0xffffffff,
                         (uv_fs_cb)0x0);
    auStack_1100._56_8_ = SEXT48(iVar5);
    auStack_1100._48_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1100._56_8_ != (uv_loop_t *)0x0) goto LAB_0018ef13;
    auStack_1100._56_8_ = uStack_10c0.result;
    auStack_1100._48_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_10c0.result != (uv_loop_t *)0x0) goto LAB_0018ef22;
    puVar18 = &uStack_10c0;
    auStack_1100._32_8_ = (uv__queue *)0x18ece3;
    uv_fs_req_cleanup(puVar18);
    auStack_1100._32_8_ = (uv__queue *)0x18ed0b;
    iVar5 = uv_fs_lchown(loop,puVar18,"test_file_link",0xffffffff,0xffffffff,lchown_cb);
    auStack_1100._56_8_ = SEXT48(iVar5);
    auStack_1100._48_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1100._56_8_ != (uv_loop_t *)0x0) goto LAB_0018ef31;
    auStack_1100._32_8_ = (uv__queue *)0x18ed39;
    uv_run(loop,UV_RUN_DEFAULT);
    auStack_1100._56_8_ = (uv_loop_t *)0x1;
    auStack_1100._48_8_ = SEXT48(lchown_cb_count);
    if ((uv_loop_t *)auStack_1100._48_8_ != (uv_loop_t *)0x1) goto LAB_0018ef40;
    auStack_1100._32_8_ = (uv__queue *)0x18ed6e;
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&uStack_10c0,uVar14,(uv_fs_cb)0x0);
    auStack_1100._56_8_ = SEXT48(iVar5);
    auStack_1100._48_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1100._56_8_ != (uv_loop_t *)0x0) goto LAB_0018ef4f;
    auStack_1100._56_8_ = uStack_10c0.result;
    auStack_1100._48_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_10c0.result != (uv_loop_t *)0x0) goto LAB_0018ef5e;
    auStack_1100._32_8_ = (uv__queue *)0x18edbb;
    uv_fs_req_cleanup(&uStack_10c0);
    auStack_1100._32_8_ = (uv__queue *)0x18edc9;
    uv_run(loop,UV_RUN_DEFAULT);
    auStack_1100._32_8_ = (uv__queue *)0x18edd5;
    unlink("test_file");
    auStack_1100._32_8_ = (uv__queue *)0x18ede1;
    unlink("test_file_link");
    puVar15 = loop;
    auStack_1100._32_8_ = (uv__queue *)0x18edf9;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    auStack_1100._32_8_ = (uv__queue *)0x18ee03;
    uv_run(puVar15,UV_RUN_DEFAULT);
    auStack_1100._56_8_ = (uv_loop_t *)0x0;
    auStack_1100._32_8_ = (uv__queue *)0x18ee18;
    iVar5 = uv_loop_close(loop);
    auStack_1100._48_8_ = SEXT48(iVar5);
    if (auStack_1100._56_8_ == auStack_1100._48_8_) {
      auStack_1100._32_8_ = (uv__queue *)0x18ee34;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_1100._32_8_ = (uv__queue *)0x18ee50;
    run_test_fs_chown_cold_1();
LAB_0018ee50:
    auStack_1100._32_8_ = (uv__queue *)0x18ee5f;
    run_test_fs_chown_cold_21();
LAB_0018ee5f:
    auStack_1100._32_8_ = (uv__queue *)0x18ee6e;
    run_test_fs_chown_cold_2();
LAB_0018ee6e:
    auStack_1100._32_8_ = (uv__queue *)0x18ee7d;
    run_test_fs_chown_cold_3();
LAB_0018ee7d:
    auStack_1100._32_8_ = (uv__queue *)0x18ee8c;
    run_test_fs_chown_cold_4();
LAB_0018ee8c:
    auStack_1100._32_8_ = (uv__queue *)0x18ee9b;
    run_test_fs_chown_cold_5();
LAB_0018ee9b:
    auStack_1100._32_8_ = (uv__queue *)0x18eeaa;
    run_test_fs_chown_cold_6();
LAB_0018eeaa:
    auStack_1100._32_8_ = (uv__queue *)0x18eeb9;
    run_test_fs_chown_cold_7();
LAB_0018eeb9:
    auStack_1100._32_8_ = (uv__queue *)0x18eec8;
    run_test_fs_chown_cold_8();
LAB_0018eec8:
    auStack_1100._32_8_ = (uv__queue *)0x18eed7;
    run_test_fs_chown_cold_9();
LAB_0018eed7:
    auStack_1100._32_8_ = (uv__queue *)0x18eee6;
    run_test_fs_chown_cold_10();
LAB_0018eee6:
    auStack_1100._32_8_ = (uv__queue *)0x18eef5;
    run_test_fs_chown_cold_11();
LAB_0018eef5:
    auStack_1100._32_8_ = (uv__queue *)0x18ef04;
    run_test_fs_chown_cold_12();
LAB_0018ef04:
    auStack_1100._32_8_ = (uv__queue *)0x18ef13;
    run_test_fs_chown_cold_13();
LAB_0018ef13:
    auStack_1100._32_8_ = (uv__queue *)0x18ef22;
    run_test_fs_chown_cold_14();
LAB_0018ef22:
    auStack_1100._32_8_ = (uv__queue *)0x18ef31;
    run_test_fs_chown_cold_15();
LAB_0018ef31:
    auStack_1100._32_8_ = (uv__queue *)0x18ef40;
    run_test_fs_chown_cold_16();
LAB_0018ef40:
    auStack_1100._32_8_ = (uv__queue *)0x18ef4f;
    run_test_fs_chown_cold_17();
LAB_0018ef4f:
    auStack_1100._32_8_ = (uv__queue *)0x18ef5e;
    run_test_fs_chown_cold_18();
LAB_0018ef5e:
    auStack_1100._32_8_ = (uv__queue *)0x18ef6d;
    run_test_fs_chown_cold_19();
  }
  puVar17 = (uv_fs_t *)(auStack_1100 + 0x38);
  auStack_1100._32_8_ = chown_cb;
  run_test_fs_chown_cold_20();
  auStack_1100._32_8_ = SEXT48(puVar17->fs_type);
  auStack_1100._24_8_ = (uv__io_cb)0x1a;
  if ((uv__queue *)auStack_1100._32_8_ == (uv__queue *)0x1a) {
    auStack_1100._32_8_ = puVar17->result;
    auStack_1100._24_8_ = (uv__io_cb)0x0;
    if ((uv__queue *)auStack_1100._32_8_ == (uv__queue *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup(puVar17);
      return extraout_EAX_08;
    }
  }
  else {
    auStack_1100._8_8_ = (uv_loop_t *)0x18efda;
    chown_cb_cold_1();
  }
  puVar9 = (uv_loop_t *)(auStack_1100 + 0x20);
  auStack_1100._8_8_ = chown_root_cb;
  chown_cb_cold_2();
  auStack_1100._0_8_ = SEXT48(*(int *)(puVar9->reserved + 2));
  auStack_1110._8_8_ = (uv_loop_t *)0x1a;
  auStack_1100._8_8_ = puVar15;
  if ((void *)auStack_1100._0_8_ == (void *)0x1a) {
    auStack_1110._0_8_ = (void *)0x18f012;
    _Var7 = geteuid();
    if (_Var7 != 0) {
      auStack_1100._0_8_ = puVar9->flags;
      auStack_1110._8_8_ = (uv_loop_t *)0xffffffffffffffff;
      if ((void *)auStack_1100._0_8_ == (void *)0xffffffffffffffff) goto LAB_0018f05b;
      auStack_1110._0_8_ = (void *)0x18f03f;
      chown_root_cb_cold_2();
    }
    auStack_1100._0_8_ = puVar9->flags;
    auStack_1110._8_8_ = (uv_loop_t *)0x0;
    puVar15 = puVar9;
    if ((void *)auStack_1100._0_8_ == (void *)0x0) {
LAB_0018f05b:
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar9);
      return extraout_EAX_09;
    }
  }
  else {
    auStack_1110._0_8_ = (void *)0x18f07b;
    chown_root_cb_cold_1();
  }
  puVar17 = (uv_fs_t *)auStack_1100;
  auStack_1110._0_8_ = fchown_cb;
  chown_root_cb_cold_3();
  auStack_1110._0_8_ = SEXT48(puVar17->fs_type);
  uStack_1118._0_4_ = 0x1b;
  uStack_1118._4_4_ = 0;
  if ((void *)auStack_1110._0_8_ == (void *)0x1b) {
    auStack_1110._0_8_ = puVar17->result;
    uStack_1118._0_4_ = 0;
    uStack_1118._4_4_ = 0;
    if ((void *)auStack_1110._0_8_ == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      uv_fs_req_cleanup(puVar17);
      return extraout_EAX_10;
    }
  }
  else {
    uStack_1128._0_4_ = 0x18f0e6;
    uStack_1128._4_4_ = 0;
    fchown_cb_cold_1();
  }
  puVar17 = (uv_fs_t *)auStack_1110;
  uStack_1128 = lchown_cb;
  fchown_cb_cold_2();
  uStack_1128 = (code *)(long)puVar17->fs_type;
  auStack_1310._480_8_ = (uv__queue *)0x1c;
  if (uStack_1128 == (code *)0x1c) {
    uStack_1128 = (code *)puVar17->result;
    auStack_1310._480_8_ = (uv__queue *)0x0;
    if (uStack_1128 == (code *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      uv_fs_req_cleanup(puVar17);
      return extraout_EAX_11;
    }
  }
  else {
    auStack_1310._464_8_ = (uv__queue *)0x18f153;
    lchown_cb_cold_1();
  }
  auStack_1310._464_8_ = run_test_fs_link;
  lchown_cb_cold_2();
  puVar9 = (uv_loop_t *)0x1faf2d;
  pcStackY_1338 = (code *)0x18f17d;
  auStack_1310._448_8_ = puVar15;
  auStack_1310._456_8_ = puVar18;
  auStack_1310._464_8_ = puVar19;
  unlink("test_file");
  pcStackY_1338 = (code *)0x18f189;
  unlink("test_file_link");
  pcStackY_1338 = (code *)0x18f195;
  unlink("test_file_link2");
  pcStackY_1338 = (code *)0x18f19a;
  loop = uv_default_loop();
  pcStackY_1338 = (code *)0x18f1be;
  iVar5 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_1310,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar3 = auStack_1310._88_8_;
  auStack_1318 = (undefined1  [8])(long)iVar5;
  if (auStack_1318 == (undefined1  [8])0x0) {
    auStack_1318 = (undefined1  [8])auStack_1310._88_8_;
    puVar9 = (uv_loop_t *)auStack_1310._88_8_;
    if ((long)auStack_1310._88_8_ < 0) goto LAB_0018f71c;
    puVar18 = (uv_fs_t *)auStack_1310;
    pcStackY_1338 = (code *)0x18f20e;
    uv_fs_req_cleanup(puVar18);
    pcStackY_1338 = (code *)0x18f21f;
    uVar20 = uv_buf_init(test_buf,0xd);
    pcStackY_1338 = (code *)0x18f255;
    iov = uVar20;
    iVar5 = uv_fs_write((uv_loop_t *)0x0,puVar18,(uv_os_fd_t)uVar3,&iov,1,-1,(uv_fs_cb)0x0);
    auStack_1318 = (undefined1  [8])(long)iVar5;
    puVar9 = (uv_loop_t *)uVar3;
    if (auStack_1318 != (undefined1  [8])0xd) goto LAB_0018f72b;
    auStack_1318 = (undefined1  [8])auStack_1310._88_8_;
    if ((uv_loop_t *)auStack_1310._88_8_ != (uv_loop_t *)0xd) goto LAB_0018f73a;
    puVar18 = (uv_fs_t *)auStack_1310;
    pcStackY_1338 = (code *)0x18f2a5;
    uv_fs_req_cleanup(puVar18);
    pcStackY_1338 = (code *)0x18f2b3;
    iVar5 = uv_fs_close((uv_loop_t *)0x0,puVar18,(uv_os_fd_t)uVar3,(uv_fs_cb)0x0);
    if (iVar5 != 0) goto LAB_0018f749;
    if ((uv_loop_t *)auStack_1310._88_8_ != (uv_loop_t *)0x0) goto LAB_0018f74e;
    puVar9 = (uv_loop_t *)auStack_1310;
    pcStackY_1338 = (code *)0x18f2d4;
    uv_fs_req_cleanup((uv_fs_t *)puVar9);
    pcStackY_1338 = (code *)0x18f2ef;
    iVar5 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)puVar9,"test_file","test_file_link",(uv_fs_cb)0x0
                      );
    auStack_1318 = (undefined1  [8])(long)iVar5;
    if (auStack_1318 != (undefined1  [8])0x0) goto LAB_0018f753;
    auStack_1318 = (undefined1  [8])auStack_1310._88_8_;
    if ((uv_loop_t *)auStack_1310._88_8_ != (uv_loop_t *)0x0) goto LAB_0018f762;
    pcStackY_1338 = (code *)0x18f33f;
    uv_fs_req_cleanup((uv_fs_t *)auStack_1310);
    pcStackY_1338 = (code *)0x18f35b;
    iVar5 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_1310,"test_file_link",2,0,(uv_fs_cb)0x0);
    puVar15 = (uv_loop_t *)auStack_1310._88_8_;
    auStack_1318 = (undefined1  [8])(long)iVar5;
    puVar9 = (uv_loop_t *)auStack_1310;
    if (auStack_1318 != (undefined1  [8])0x0) goto LAB_0018f771;
    auStack_1318 = (undefined1  [8])auStack_1310._88_8_;
    if ((long)auStack_1310._88_8_ < 0) goto LAB_0018f780;
    puVar18 = (uv_fs_t *)auStack_1310;
    pcStackY_1338 = (code *)0x18f3ab;
    uv_fs_req_cleanup(puVar18);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_1338 = (code *)0x18f3cd;
    uVar20 = uv_buf_init(buf,0x20);
    pcStackY_1338 = (code *)0x18f3fe;
    iov = uVar20;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,puVar18,(uv_os_fd_t)puVar15,&iov,1,0,(uv_fs_cb)0x0);
    auStack_1318 = (undefined1  [8])(long)iVar5;
    if ((long)auStack_1318 < 0) goto LAB_0018f78f;
    auStack_1318 = (undefined1  [8])auStack_1310._88_8_;
    if ((long)auStack_1310._88_8_ < 0) goto LAB_0018f79e;
    pcStackY_1338 = (code *)0x18f450;
    iVar5 = strcmp(buf,test_buf);
    auStack_1318 = (undefined1  [8])(long)iVar5;
    if (auStack_1318 != (undefined1  [8])0x0) goto LAB_0018f7ad;
    pcStackY_1338 = (code *)0x18f480;
    iVar5 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)auStack_1310,(uv_os_fd_t)puVar15,(uv_fs_cb)0x0);
    if (iVar5 != 0) goto LAB_0018f7bc;
    if ((uv_loop_t *)auStack_1310._88_8_ != (uv_loop_t *)0x0) goto LAB_0018f7c1;
    puVar15 = (uv_loop_t *)auStack_1310;
    pcStackY_1338 = (code *)0x18f4a1;
    uv_fs_req_cleanup((uv_fs_t *)puVar15);
    pcStackY_1338 = (code *)0x18f4c5;
    iVar5 = uv_fs_link(loop,(uv_fs_t *)puVar15,"test_file","test_file_link2",link_cb);
    auStack_1318 = (undefined1  [8])(long)iVar5;
    if (auStack_1318 != (undefined1  [8])0x0) goto LAB_0018f7c6;
    pcStackY_1338 = (code *)0x18f4f3;
    uv_run(loop,UV_RUN_DEFAULT);
    auStack_1318 = (undefined1  [8])0x1;
    if (link_cb_count != 1) goto LAB_0018f7d5;
    pcStackY_1338 = (code *)0x18f536;
    iVar5 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_1310,"test_file_link2",2,0,(uv_fs_cb)0x0)
    ;
    puVar9 = (uv_loop_t *)auStack_1310._88_8_;
    auStack_1318 = (undefined1  [8])(long)iVar5;
    if (auStack_1318 != (undefined1  [8])0x0) goto LAB_0018f7e4;
    auStack_1318 = (undefined1  [8])auStack_1310._88_8_;
    if ((long)auStack_1310._88_8_ < 0) goto LAB_0018f7f3;
    puVar18 = (uv_fs_t *)auStack_1310;
    pcStackY_1338 = (code *)0x18f586;
    uv_fs_req_cleanup(puVar18);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_1338 = (code *)0x18f5a8;
    uVar20 = uv_buf_init(buf,0x20);
    pcStackY_1338 = (code *)0x18f5d9;
    iov = uVar20;
    iVar5 = uv_fs_read((uv_loop_t *)0x0,puVar18,(uv_os_fd_t)puVar9,&iov,1,0,(uv_fs_cb)0x0);
    auStack_1318 = (undefined1  [8])(long)iVar5;
    if ((long)auStack_1318 < 0) goto LAB_0018f802;
    auStack_1318 = (undefined1  [8])auStack_1310._88_8_;
    if ((long)auStack_1310._88_8_ < 0) goto LAB_0018f811;
    pcStackY_1338 = (code *)0x18f62b;
    iVar5 = strcmp(buf,test_buf);
    auStack_1318 = (undefined1  [8])(long)iVar5;
    if (auStack_1318 != (undefined1  [8])0x0) goto LAB_0018f820;
    pcStackY_1338 = (code *)0x18f65b;
    iVar5 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)auStack_1310,(uv_os_fd_t)puVar9,(uv_fs_cb)0x0);
    if (iVar5 != 0) goto LAB_0018f82f;
    if ((uv_loop_t *)auStack_1310._88_8_ != (uv_loop_t *)0x0) goto LAB_0018f834;
    pcStackY_1338 = (code *)0x18f679;
    uv_fs_req_cleanup((uv_fs_t *)auStack_1310);
    pcStackY_1338 = (code *)0x18f687;
    uv_run(loop,UV_RUN_DEFAULT);
    pcStackY_1338 = (code *)0x18f693;
    unlink("test_file");
    pcStackY_1338 = (code *)0x18f69f;
    unlink("test_file_link");
    pcStackY_1338 = (code *)0x18f6ab;
    unlink("test_file_link2");
    puVar9 = loop;
    pcStackY_1338 = (code *)0x18f6c3;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    pcStackY_1338 = (code *)0x18f6cd;
    uv_run(puVar9,UV_RUN_DEFAULT);
    auStack_1318 = (undefined1  [8])0x0;
    pcStackY_1338 = (code *)0x18f6e2;
    iVar5 = uv_loop_close(loop);
    if (auStack_1318 == (undefined1  [8])(long)iVar5) {
      pcStackY_1338 = (code *)0x18f6fe;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStackY_1338 = (code *)0x18f71c;
    run_test_fs_link_cold_1();
LAB_0018f71c:
    pcStackY_1338 = (code *)0x18f72b;
    run_test_fs_link_cold_25();
LAB_0018f72b:
    pcStackY_1338 = (code *)0x18f73a;
    run_test_fs_link_cold_2();
LAB_0018f73a:
    pcStackY_1338 = (code *)0x18f749;
    run_test_fs_link_cold_3();
LAB_0018f749:
    pcStackY_1338 = (code *)0x18f74e;
    run_test_fs_link_cold_4();
LAB_0018f74e:
    pcStackY_1338 = (code *)0x18f753;
    run_test_fs_link_cold_5();
LAB_0018f753:
    pcStackY_1338 = (code *)0x18f762;
    run_test_fs_link_cold_6();
LAB_0018f762:
    pcStackY_1338 = (code *)0x18f771;
    run_test_fs_link_cold_7();
LAB_0018f771:
    puVar15 = puVar9;
    pcStackY_1338 = (code *)0x18f780;
    run_test_fs_link_cold_8();
LAB_0018f780:
    pcStackY_1338 = (code *)0x18f78f;
    run_test_fs_link_cold_24();
LAB_0018f78f:
    pcStackY_1338 = (code *)0x18f79e;
    run_test_fs_link_cold_23();
LAB_0018f79e:
    pcStackY_1338 = (code *)0x18f7ad;
    run_test_fs_link_cold_22();
LAB_0018f7ad:
    pcStackY_1338 = (code *)0x18f7bc;
    run_test_fs_link_cold_9();
LAB_0018f7bc:
    pcStackY_1338 = (code *)0x18f7c1;
    run_test_fs_link_cold_10();
LAB_0018f7c1:
    pcStackY_1338 = (code *)0x18f7c6;
    run_test_fs_link_cold_11();
LAB_0018f7c6:
    pcStackY_1338 = (code *)0x18f7d5;
    run_test_fs_link_cold_12();
LAB_0018f7d5:
    pcStackY_1338 = (code *)0x18f7e4;
    run_test_fs_link_cold_13();
LAB_0018f7e4:
    puVar9 = puVar15;
    pcStackY_1338 = (code *)0x18f7f3;
    run_test_fs_link_cold_14();
LAB_0018f7f3:
    pcStackY_1338 = (code *)0x18f802;
    run_test_fs_link_cold_21();
LAB_0018f802:
    pcStackY_1338 = (code *)0x18f811;
    run_test_fs_link_cold_20();
LAB_0018f811:
    pcStackY_1338 = (code *)0x18f820;
    run_test_fs_link_cold_19();
LAB_0018f820:
    pcStackY_1338 = (code *)0x18f82f;
    run_test_fs_link_cold_15();
LAB_0018f82f:
    pcStackY_1338 = (code *)0x18f834;
    run_test_fs_link_cold_16();
LAB_0018f834:
    pcStackY_1338 = (code *)0x18f839;
    run_test_fs_link_cold_17();
  }
  puVar17 = (uv_fs_t *)auStack_1318;
  pcStackY_1338 = link_cb;
  run_test_fs_link_cold_18();
  pcStackY_1338 = (code *)(long)puVar17->fs_type;
  uStackY_1340 = 0x17;
  if (pcStackY_1338 == (code *)0x17) {
    pcStackY_1338 = (code *)puVar17->result;
    uStackY_1340 = 0;
    if (pcStackY_1338 == (code *)0x0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup(puVar17);
      return extraout_EAX_12;
    }
  }
  else {
    puStackY_1350 = (uv_fs_t *)0x18f8a6;
    link_cb_cold_1();
  }
  puStackY_1350 = (uv_fs_t *)run_test_fs_readlink;
  link_cb_cold_2();
  puStackY_1358 = puVar9;
  puStackY_1350 = puVar18;
  loop = uv_default_loop();
  iVar5 = uv_fs_readlink(loop,&uStackY_1518,"no_such_file",dummy_cb);
  if (iVar5 == 0) {
    iVar5 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar5 != 0) goto LAB_0018fb8b;
    if (dummy_cb_count != 1) goto LAB_0018fb9a;
    if (uStackY_1518.ptr != (void *)0x0) goto LAB_0018fba9;
    if (uStackY_1518.result != -2) goto LAB_0018fbae;
    uv_fs_req_cleanup(&uStackY_1518);
    iVar5 = uv_fs_readlink((uv_loop_t *)0x0,&uStackY_1518,"no_such_file",(uv_fs_cb)0x0);
    if (iVar5 != -2) goto LAB_0018fbbd;
    if (uStackY_1518.ptr != (void *)0x0) goto LAB_0018fbcc;
    if (uStackY_1518.result != -2) goto LAB_0018fbd1;
    uv_fs_req_cleanup(&uStackY_1518);
    iVar5 = uv_fs_open((uv_loop_t *)0x0,&uStackY_1518,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    sVar2 = uStackY_1518.result;
    if (iVar5 != 0) goto LAB_0018fbe0;
    if (uStackY_1518.result < 0) goto LAB_0018fbef;
    uv_fs_req_cleanup(&uStackY_1518);
    iVar5 = uv_fs_close((uv_loop_t *)0x0,&uStackY_1518,(uv_os_fd_t)sVar2,(uv_fs_cb)0x0);
    if (iVar5 != 0) goto LAB_0018fbfe;
    if (uStackY_1518.result != 0) goto LAB_0018fc0d;
    uv_fs_req_cleanup(&uStackY_1518);
    iVar5 = uv_fs_readlink((uv_loop_t *)0x0,&uStackY_1518,"test_file",(uv_fs_cb)0x0);
    if (iVar5 == -0x16) {
      uv_fs_req_cleanup(&uStackY_1518);
      unlink("test_file");
      puVar9 = loop;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(puVar9,UV_RUN_DEFAULT);
      uStackY_1518.data = (void *)0x0;
      iVar5 = uv_loop_close(loop);
      if (uStackY_1518.data == (void *)(long)iVar5) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0018fc2b;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_0018fb8b:
    run_test_fs_readlink_cold_2();
LAB_0018fb9a:
    run_test_fs_readlink_cold_3();
LAB_0018fba9:
    run_test_fs_readlink_cold_4();
LAB_0018fbae:
    run_test_fs_readlink_cold_5();
LAB_0018fbbd:
    run_test_fs_readlink_cold_6();
LAB_0018fbcc:
    run_test_fs_readlink_cold_7();
LAB_0018fbd1:
    run_test_fs_readlink_cold_8();
LAB_0018fbe0:
    run_test_fs_readlink_cold_9();
LAB_0018fbef:
    run_test_fs_readlink_cold_14();
LAB_0018fbfe:
    run_test_fs_readlink_cold_10();
LAB_0018fc0d:
    run_test_fs_readlink_cold_11();
  }
  run_test_fs_readlink_cold_12();
LAB_0018fc2b:
  run_test_fs_readlink_cold_13();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX_13;
}

Assistant:

TEST_IMPL(fs_mkdtemp) {
  int r;
  const char* path_template = "test_dir_XXXXXX";

  loop = uv_default_loop();

  r = uv_fs_mkdtemp(loop, &mkdtemp_req1, path_template, mkdtemp_cb);
  ASSERT_OK(r);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_EQ(1, mkdtemp_cb_count);

  /* sync mkdtemp */
  r = uv_fs_mkdtemp(NULL, &mkdtemp_req2, path_template, NULL);
  ASSERT_OK(r);
  check_mkdtemp_result(&mkdtemp_req2);

  /* mkdtemp return different values on subsequent calls */
  ASSERT_NE(0, strcmp(mkdtemp_req1.path, mkdtemp_req2.path));

  /* Cleanup */
  rmdir(mkdtemp_req1.path);
  rmdir(mkdtemp_req2.path);
  uv_fs_req_cleanup(&mkdtemp_req1);
  uv_fs_req_cleanup(&mkdtemp_req2);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}